

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Primitive PVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined3 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  bool bVar27;
  undefined8 uVar28;
  RTCFeatureFlags RVar29;
  undefined1 auVar30 [16];
  undefined6 uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  byte bVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  RTCFilterFunctionN p_Var58;
  RayHitK<4> *pRVar59;
  int iVar60;
  RTCIntersectArguments *pRVar61;
  RTCIntersectArguments *pRVar62;
  ulong uVar63;
  long lVar64;
  bool bVar65;
  uint uVar66;
  uint uVar67;
  int iVar68;
  uint uVar69;
  uint uVar70;
  short sVar71;
  float t1;
  undefined2 uVar100;
  float fVar72;
  float fVar101;
  float fVar102;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar103;
  float fVar123;
  float fVar124;
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar142;
  float fVar143;
  vfloat4 v;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar144;
  float fVar161;
  float fVar162;
  vfloat4 v_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  float fVar163;
  float fVar164;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar174;
  float fVar197;
  float fVar198;
  vfloat_impl<4> p00;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  float fVar209;
  float fVar210;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar211;
  float fVar220;
  float fVar221;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar222;
  float fVar232;
  float fVar233;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar246;
  float fVar248;
  vfloat4 a;
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar247;
  float fVar249;
  float fVar250;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar251;
  float fVar252;
  float fVar261;
  float fVar263;
  vfloat4 a_2;
  undefined1 auVar253 [16];
  undefined1 auVar256 [16];
  float fVar262;
  float fVar264;
  float fVar265;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar266;
  float fVar275;
  float fVar276;
  vfloat4 a_3;
  float fVar277;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar289;
  float fVar292;
  float fVar295;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar285 [16];
  float fVar290;
  float fVar291;
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar297;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar318;
  float fVar319;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float fStack_540;
  float fStack_53c;
  undefined8 local_538;
  undefined8 local_528;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e8;
  Primitive *local_3e0;
  ulong local_3d8;
  long local_3d0;
  RTCFilterFunctionNArguments local_3c8;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  uint auStack_308 [4];
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  undefined1 local_e8 [12];
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 auStack_58 [5];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 uVar99;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar159 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  
  PVar12 = prim[1];
  uVar54 = (ulong)(byte)PVar12;
  lVar19 = uVar54 * 0x25;
  pPVar4 = prim + lVar19 + 6;
  fVar143 = *(float *)(pPVar4 + 0xc);
  fVar144 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar143;
  fVar161 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar143;
  fVar162 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar143;
  fVar125 = *(float *)(ray + k * 4 + 0x40) * fVar143;
  fVar142 = *(float *)(ray + k * 4 + 0x50) * fVar143;
  fVar143 = *(float *)(ray + k * 4 + 0x60) * fVar143;
  uVar13 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar239._8_4_ = 0;
  auVar239._0_8_ = uVar55;
  auVar239._12_2_ = uVar100;
  auVar239._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar127._12_4_ = auVar239._12_4_;
  auVar127._8_2_ = 0;
  auVar127._0_8_ = uVar55;
  auVar127._10_2_ = uVar100;
  auVar73._10_6_ = auVar127._10_6_;
  auVar73._8_2_ = uVar100;
  auVar73._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar32._4_8_ = auVar73._8_8_;
  auVar32._2_2_ = uVar100;
  auVar32._0_2_ = uVar100;
  fVar298 = (float)((int)sVar71 >> 8);
  fVar306 = (float)(auVar32._0_4_ >> 0x18);
  fVar310 = (float)(auVar73._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar55;
  auVar106._12_2_ = uVar100;
  auVar106._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_2_ = 0;
  auVar105._0_8_ = uVar55;
  auVar105._10_2_ = uVar100;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = uVar100;
  auVar104._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar33._4_8_ = auVar104._8_8_;
  auVar33._2_2_ = uVar100;
  auVar33._0_2_ = uVar100;
  fVar163 = (float)((int)sVar71 >> 8);
  fVar167 = (float)(auVar33._0_4_ >> 0x18);
  fVar169 = (float)(auVar104._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar55;
  auVar109._12_2_ = uVar100;
  auVar109._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar55;
  auVar108._10_2_ = uVar100;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar100;
  auVar107._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar34._4_8_ = auVar107._8_8_;
  auVar34._2_2_ = uVar100;
  auVar34._0_2_ = uVar100;
  fVar199 = (float)((int)sVar71 >> 8);
  fVar209 = (float)(auVar34._0_4_ >> 0x18);
  fVar210 = (float)(auVar107._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar55;
  auVar112._12_2_ = uVar100;
  auVar112._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar55;
  auVar111._10_2_ = uVar100;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar100;
  auVar110._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar35._4_8_ = auVar110._8_8_;
  auVar35._2_2_ = uVar100;
  auVar35._0_2_ = uVar100;
  fVar72 = (float)((int)sVar71 >> 8);
  fVar101 = (float)(auVar35._0_4_ >> 0x18);
  fVar102 = (float)(auVar110._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar55;
  auVar177._12_2_ = uVar100;
  auVar177._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar55;
  auVar176._10_2_ = uVar100;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar100;
  auVar175._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar36._4_8_ = auVar175._8_8_;
  auVar36._2_2_ = uVar100;
  auVar36._0_2_ = uVar100;
  fVar211 = (float)((int)sVar71 >> 8);
  fVar220 = (float)(auVar36._0_4_ >> 0x18);
  fVar221 = (float)(auVar175._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar54 + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar55;
  auVar180._12_2_ = uVar100;
  auVar180._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar55;
  auVar179._10_2_ = uVar100;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar100;
  auVar178._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar37._4_8_ = auVar178._8_8_;
  auVar37._2_2_ = uVar100;
  auVar37._0_2_ = uVar100;
  fVar234 = (float)((int)sVar71 >> 8);
  fVar246 = (float)(auVar37._0_4_ >> 0x18);
  fVar248 = (float)(auVar178._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar55;
  auVar183._12_2_ = uVar100;
  auVar183._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar55;
  auVar182._10_2_ = uVar100;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar100;
  auVar181._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar38._4_8_ = auVar181._8_8_;
  auVar38._2_2_ = uVar100;
  auVar38._0_2_ = uVar100;
  fVar222 = (float)((int)sVar71 >> 8);
  fVar232 = (float)(auVar38._0_4_ >> 0x18);
  fVar233 = (float)(auVar181._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar55;
  auVar186._12_2_ = uVar100;
  auVar186._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar55;
  auVar185._10_2_ = uVar100;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar100;
  auVar184._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar39._4_8_ = auVar184._8_8_;
  auVar39._2_2_ = uVar100;
  auVar39._0_2_ = uVar100;
  fVar251 = (float)((int)sVar71 >> 8);
  fVar261 = (float)(auVar39._0_4_ >> 0x18);
  fVar263 = (float)(auVar184._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar99 = (undefined1)((uint)uVar13 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar13));
  uVar99 = (undefined1)((uint)uVar13 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar13,(char)uVar13);
  uVar55 = CONCAT62(uVar31,sVar71);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar55;
  auVar189._12_2_ = uVar100;
  auVar189._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar55;
  auVar188._10_2_ = uVar100;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar100;
  auVar187._0_8_ = uVar55;
  uVar100 = (undefined2)uVar31;
  auVar40._4_8_ = auVar187._8_8_;
  auVar40._2_2_ = uVar100;
  auVar40._0_2_ = uVar100;
  fVar103 = (float)((int)sVar71 >> 8);
  fVar123 = (float)(auVar40._0_4_ >> 0x18);
  fVar124 = (float)(auVar187._8_4_ >> 0x18);
  fVar278 = fVar125 * fVar298 + fVar142 * fVar163 + fVar143 * fVar199;
  fVar289 = fVar125 * fVar306 + fVar142 * fVar167 + fVar143 * fVar209;
  fVar292 = fVar125 * fVar310 + fVar142 * fVar169 + fVar143 * fVar210;
  fVar295 = fVar125 * (float)(auVar127._12_4_ >> 0x18) +
            fVar142 * (float)(auVar105._12_4_ >> 0x18) + fVar143 * (float)(auVar108._12_4_ >> 0x18);
  fVar266 = fVar125 * fVar72 + fVar142 * fVar211 + fVar143 * fVar234;
  fVar275 = fVar125 * fVar101 + fVar142 * fVar220 + fVar143 * fVar246;
  fVar276 = fVar125 * fVar102 + fVar142 * fVar221 + fVar143 * fVar248;
  fVar277 = fVar125 * (float)(auVar111._12_4_ >> 0x18) +
            fVar142 * (float)(auVar176._12_4_ >> 0x18) + fVar143 * (float)(auVar179._12_4_ >> 0x18);
  fVar174 = fVar125 * fVar222 + fVar142 * fVar251 + fVar143 * fVar103;
  fVar197 = fVar125 * fVar232 + fVar142 * fVar261 + fVar143 * fVar123;
  fVar198 = fVar125 * fVar233 + fVar142 * fVar263 + fVar143 * fVar124;
  fVar125 = fVar125 * (float)(auVar182._12_4_ >> 0x18) +
            fVar142 * (float)(auVar185._12_4_ >> 0x18) + fVar143 * (float)(auVar188._12_4_ >> 0x18);
  fVar299 = fVar298 * fVar144 + fVar163 * fVar161 + fVar199 * fVar162;
  fVar306 = fVar306 * fVar144 + fVar167 * fVar161 + fVar209 * fVar162;
  fVar310 = fVar310 * fVar144 + fVar169 * fVar161 + fVar210 * fVar162;
  fVar314 = (float)(auVar127._12_4_ >> 0x18) * fVar144 +
            (float)(auVar105._12_4_ >> 0x18) * fVar161 + (float)(auVar108._12_4_ >> 0x18) * fVar162;
  fVar234 = fVar72 * fVar144 + fVar211 * fVar161 + fVar234 * fVar162;
  fVar246 = fVar101 * fVar144 + fVar220 * fVar161 + fVar246 * fVar162;
  fVar248 = fVar102 * fVar144 + fVar221 * fVar161 + fVar248 * fVar162;
  fVar298 = (float)(auVar111._12_4_ >> 0x18) * fVar144 +
            (float)(auVar176._12_4_ >> 0x18) * fVar161 + (float)(auVar179._12_4_ >> 0x18) * fVar162;
  fVar222 = fVar144 * fVar222 + fVar161 * fVar251 + fVar162 * fVar103;
  fVar232 = fVar144 * fVar232 + fVar161 * fVar261 + fVar162 * fVar123;
  fVar233 = fVar144 * fVar233 + fVar161 * fVar263 + fVar162 * fVar124;
  fVar251 = fVar144 * (float)(auVar182._12_4_ >> 0x18) +
            fVar161 * (float)(auVar185._12_4_ >> 0x18) + fVar162 * (float)(auVar188._12_4_ >> 0x18);
  fVar143 = (float)DAT_01ff1d40;
  fVar72 = DAT_01ff1d40._4_4_;
  fVar101 = DAT_01ff1d40._8_4_;
  fVar102 = DAT_01ff1d40._12_4_;
  uVar66 = -(uint)(fVar143 <= ABS(fVar278));
  uVar67 = -(uint)(fVar72 <= ABS(fVar289));
  uVar69 = -(uint)(fVar101 <= ABS(fVar292));
  uVar70 = -(uint)(fVar102 <= ABS(fVar295));
  auVar281._0_4_ = (uint)fVar278 & uVar66;
  auVar281._4_4_ = (uint)fVar289 & uVar67;
  auVar281._8_4_ = (uint)fVar292 & uVar69;
  auVar281._12_4_ = (uint)fVar295 & uVar70;
  auVar145._0_4_ = ~uVar66 & (uint)fVar143;
  auVar145._4_4_ = ~uVar67 & (uint)fVar72;
  auVar145._8_4_ = ~uVar69 & (uint)fVar101;
  auVar145._12_4_ = ~uVar70 & (uint)fVar102;
  auVar145 = auVar145 | auVar281;
  uVar66 = -(uint)(fVar143 <= ABS(fVar266));
  uVar67 = -(uint)(fVar72 <= ABS(fVar275));
  uVar69 = -(uint)(fVar101 <= ABS(fVar276));
  uVar70 = -(uint)(fVar102 <= ABS(fVar277));
  auVar267._0_4_ = (uint)fVar266 & uVar66;
  auVar267._4_4_ = (uint)fVar275 & uVar67;
  auVar267._8_4_ = (uint)fVar276 & uVar69;
  auVar267._12_4_ = (uint)fVar277 & uVar70;
  auVar200._0_4_ = ~uVar66 & (uint)fVar143;
  auVar200._4_4_ = ~uVar67 & (uint)fVar72;
  auVar200._8_4_ = ~uVar69 & (uint)fVar101;
  auVar200._12_4_ = ~uVar70 & (uint)fVar102;
  auVar200 = auVar200 | auVar267;
  uVar66 = -(uint)(fVar143 <= ABS(fVar174));
  uVar67 = -(uint)(fVar72 <= ABS(fVar197));
  uVar69 = -(uint)(fVar101 <= ABS(fVar198));
  uVar70 = -(uint)(fVar102 <= ABS(fVar125));
  auVar190._0_4_ = (uint)fVar174 & uVar66;
  auVar190._4_4_ = (uint)fVar197 & uVar67;
  auVar190._8_4_ = (uint)fVar198 & uVar69;
  auVar190._12_4_ = (uint)fVar125 & uVar70;
  auVar212._0_4_ = ~uVar66 & (uint)fVar143;
  auVar212._4_4_ = ~uVar67 & (uint)fVar72;
  auVar212._8_4_ = ~uVar69 & (uint)fVar101;
  auVar212._12_4_ = ~uVar70 & (uint)fVar102;
  auVar212 = auVar212 | auVar190;
  auVar73 = rcpps(_DAT_01ff1d40,auVar145);
  fVar143 = auVar73._0_4_;
  fVar102 = auVar73._4_4_;
  fVar163 = auVar73._8_4_;
  fVar211 = auVar73._12_4_;
  fVar143 = (1.0 - auVar145._0_4_ * fVar143) * fVar143 + fVar143;
  fVar102 = (1.0 - auVar145._4_4_ * fVar102) * fVar102 + fVar102;
  fVar163 = (1.0 - auVar145._8_4_ * fVar163) * fVar163 + fVar163;
  fVar211 = (1.0 - auVar145._12_4_ * fVar211) * fVar211 + fVar211;
  auVar73 = rcpps(auVar73,auVar200);
  fVar72 = auVar73._0_4_;
  fVar103 = auVar73._4_4_;
  fVar167 = auVar73._8_4_;
  fVar220 = auVar73._12_4_;
  fVar72 = (1.0 - auVar200._0_4_ * fVar72) * fVar72 + fVar72;
  fVar103 = (1.0 - auVar200._4_4_ * fVar103) * fVar103 + fVar103;
  fVar167 = (1.0 - auVar200._8_4_ * fVar167) * fVar167 + fVar167;
  fVar220 = (1.0 - auVar200._12_4_ * fVar220) * fVar220 + fVar220;
  auVar73 = rcpps(auVar73,auVar212);
  fVar101 = auVar73._0_4_;
  fVar123 = auVar73._4_4_;
  fVar169 = auVar73._8_4_;
  fVar221 = auVar73._12_4_;
  fVar101 = (1.0 - auVar212._0_4_ * fVar101) * fVar101 + fVar101;
  fVar123 = (1.0 - auVar212._4_4_ * fVar123) * fVar123 + fVar123;
  fVar169 = (1.0 - auVar212._8_4_ * fVar169) * fVar169 + fVar169;
  fVar221 = (1.0 - auVar212._12_4_ * fVar221) * fVar221 + fVar221;
  fVar261 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar19 + 0x16)) *
            *(float *)(prim + lVar19 + 0x1a);
  uVar55 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar100 = (undefined2)(uVar55 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar55;
  auVar74._12_2_ = uVar100;
  auVar74._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar55 >> 0x20);
  auVar321._12_4_ = auVar74._12_4_;
  auVar321._8_2_ = 0;
  auVar321._0_8_ = uVar55;
  auVar321._10_2_ = uVar100;
  auVar129._10_6_ = auVar321._10_6_;
  auVar129._8_2_ = uVar100;
  auVar129._0_8_ = uVar55;
  uVar100 = (undefined2)(uVar55 >> 0x10);
  auVar41._4_8_ = auVar129._8_8_;
  auVar41._2_2_ = uVar100;
  auVar41._0_2_ = uVar100;
  fVar124 = (float)(auVar41._0_4_ >> 0x10);
  fVar174 = (float)(auVar129._8_4_ >> 0x10);
  uVar56 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar100 = (undefined2)(uVar56 >> 0x30);
  auVar148._8_4_ = 0;
  auVar148._0_8_ = uVar56;
  auVar148._12_2_ = uVar100;
  auVar148._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar56 >> 0x20);
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._8_2_ = 0;
  auVar147._0_8_ = uVar56;
  auVar147._10_2_ = uVar100;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._8_2_ = uVar100;
  auVar146._0_8_ = uVar56;
  uVar100 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar146._8_8_;
  auVar42._2_2_ = uVar100;
  auVar42._0_2_ = uVar100;
  uVar57 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar100 = (undefined2)(uVar57 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar57;
  auVar77._12_2_ = uVar100;
  auVar77._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar57 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar57;
  auVar76._10_2_ = uVar100;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar100;
  auVar75._0_8_ = uVar57;
  uVar100 = (undefined2)(uVar57 >> 0x10);
  auVar43._4_8_ = auVar75._8_8_;
  auVar43._2_2_ = uVar100;
  auVar43._0_2_ = uVar100;
  fVar125 = (float)(auVar43._0_4_ >> 0x10);
  fVar197 = (float)(auVar75._8_4_ >> 0x10);
  uVar5 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar100 = (undefined2)(uVar5 >> 0x30);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar5;
  auVar215._12_2_ = uVar100;
  auVar215._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar5 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar5;
  auVar214._10_2_ = uVar100;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar100;
  auVar213._0_8_ = uVar5;
  uVar100 = (undefined2)(uVar5 >> 0x10);
  auVar44._4_8_ = auVar213._8_8_;
  auVar44._2_2_ = uVar100;
  auVar44._0_2_ = uVar100;
  uVar6 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar100 = (undefined2)(uVar6 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar6;
  auVar80._12_2_ = uVar100;
  auVar80._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar6 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar6;
  auVar79._10_2_ = uVar100;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar100;
  auVar78._0_8_ = uVar6;
  uVar100 = (undefined2)(uVar6 >> 0x10);
  auVar45._4_8_ = auVar78._8_8_;
  auVar45._2_2_ = uVar100;
  auVar45._0_2_ = uVar100;
  fVar142 = (float)(auVar45._0_4_ >> 0x10);
  fVar198 = (float)(auVar78._8_4_ >> 0x10);
  uVar63 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar7 = *(ulong *)(prim + uVar54 * 2 + uVar63 + 6);
  uVar100 = (undefined2)(uVar7 >> 0x30);
  auVar237._8_4_ = 0;
  auVar237._0_8_ = uVar7;
  auVar237._12_2_ = uVar100;
  auVar237._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar7 >> 0x20);
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._8_2_ = 0;
  auVar236._0_8_ = uVar7;
  auVar236._10_2_ = uVar100;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._8_2_ = uVar100;
  auVar235._0_8_ = uVar7;
  uVar100 = (undefined2)(uVar7 >> 0x10);
  auVar46._4_8_ = auVar235._8_8_;
  auVar46._2_2_ = uVar100;
  auVar46._0_2_ = uVar100;
  uVar63 = *(ulong *)(prim + uVar63 + 6);
  uVar100 = (undefined2)(uVar63 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar63;
  auVar83._12_2_ = uVar100;
  auVar83._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar63 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar63;
  auVar82._10_2_ = uVar100;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar100;
  auVar81._0_8_ = uVar63;
  uVar100 = (undefined2)(uVar63 >> 0x10);
  auVar47._4_8_ = auVar81._8_8_;
  auVar47._2_2_ = uVar100;
  auVar47._0_2_ = uVar100;
  fVar144 = (float)(auVar47._0_4_ >> 0x10);
  fVar199 = (float)(auVar81._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar100 = (undefined2)(uVar8 >> 0x30);
  auVar255._8_4_ = 0;
  auVar255._0_8_ = uVar8;
  auVar255._12_2_ = uVar100;
  auVar255._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar8 >> 0x20);
  auVar254._12_4_ = auVar255._12_4_;
  auVar254._8_2_ = 0;
  auVar254._0_8_ = uVar8;
  auVar254._10_2_ = uVar100;
  auVar253._10_6_ = auVar254._10_6_;
  auVar253._8_2_ = uVar100;
  auVar253._0_8_ = uVar8;
  uVar100 = (undefined2)(uVar8 >> 0x10);
  auVar48._4_8_ = auVar253._8_8_;
  auVar48._2_2_ = uVar100;
  auVar48._0_2_ = uVar100;
  uVar9 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar100 = (undefined2)(uVar9 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar9;
  auVar86._12_2_ = uVar100;
  auVar86._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar9 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar9;
  auVar85._10_2_ = uVar100;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar100;
  auVar84._0_8_ = uVar9;
  uVar100 = (undefined2)(uVar9 >> 0x10);
  auVar49._4_8_ = auVar84._8_8_;
  auVar49._2_2_ = uVar100;
  auVar49._0_2_ = uVar100;
  fVar161 = (float)(auVar49._0_4_ >> 0x10);
  fVar209 = (float)(auVar84._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar12 * 0x20 + 6);
  uVar100 = (undefined2)(uVar10 >> 0x30);
  auVar270._8_4_ = 0;
  auVar270._0_8_ = uVar10;
  auVar270._12_2_ = uVar100;
  auVar270._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar10 >> 0x20);
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._8_2_ = 0;
  auVar269._0_8_ = uVar10;
  auVar269._10_2_ = uVar100;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._8_2_ = uVar100;
  auVar268._0_8_ = uVar10;
  uVar100 = (undefined2)(uVar10 >> 0x10);
  auVar50._4_8_ = auVar268._8_8_;
  auVar50._2_2_ = uVar100;
  auVar50._0_2_ = uVar100;
  uVar11 = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar54) + 6);
  uVar100 = (undefined2)(uVar11 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar11;
  auVar89._12_2_ = uVar100;
  auVar89._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar11 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar11;
  auVar88._10_2_ = uVar100;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar100;
  auVar87._0_8_ = uVar11;
  uVar100 = (undefined2)(uVar11 >> 0x10);
  auVar51._4_8_ = auVar87._8_8_;
  auVar51._2_2_ = uVar100;
  auVar51._0_2_ = uVar100;
  fVar162 = (float)(auVar51._0_4_ >> 0x10);
  fVar210 = (float)(auVar87._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar100 = (undefined2)(uVar54 >> 0x30);
  auVar284._8_4_ = 0;
  auVar284._0_8_ = uVar54;
  auVar284._12_2_ = uVar100;
  auVar284._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar54 >> 0x20);
  auVar283._12_4_ = auVar284._12_4_;
  auVar283._8_2_ = 0;
  auVar283._0_8_ = uVar54;
  auVar283._10_2_ = uVar100;
  auVar282._10_6_ = auVar283._10_6_;
  auVar282._8_2_ = uVar100;
  auVar282._0_8_ = uVar54;
  uVar100 = (undefined2)(uVar54 >> 0x10);
  auVar52._4_8_ = auVar282._8_8_;
  auVar52._2_2_ = uVar100;
  auVar52._0_2_ = uVar100;
  auVar149._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar124) * fVar261 + fVar124) - fVar306) *
                fVar102,((((float)(int)(short)uVar56 - (float)(int)(short)uVar55) * fVar261 +
                         (float)(int)(short)uVar55) - fVar299) * fVar143);
  auVar149._8_4_ =
       ((((float)(auVar146._8_4_ >> 0x10) - fVar174) * fVar261 + fVar174) - fVar310) * fVar163;
  auVar149._12_4_ =
       ((((float)(auVar147._12_4_ >> 0x10) - (float)(auVar321._12_4_ >> 0x10)) * fVar261 +
        (float)(auVar321._12_4_ >> 0x10)) - fVar314) * fVar211;
  auVar216._0_4_ =
       ((((float)(int)(short)uVar5 - (float)(int)(short)uVar57) * fVar261 +
        (float)(int)(short)uVar57) - fVar299) * fVar143;
  auVar216._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar125) * fVar261 + fVar125) - fVar306) * fVar102;
  auVar216._8_4_ =
       ((((float)(auVar213._8_4_ >> 0x10) - fVar197) * fVar261 + fVar197) - fVar310) * fVar163;
  auVar216._12_4_ =
       ((((float)(auVar214._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar261 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar314) * fVar211;
  auVar238._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar142) * fVar261 + fVar142) - fVar246) *
                fVar103,((((float)(int)(short)uVar7 - (float)(int)(short)uVar6) * fVar261 +
                         (float)(int)(short)uVar6) - fVar234) * fVar72);
  auVar238._8_4_ =
       ((((float)(auVar235._8_4_ >> 0x10) - fVar198) * fVar261 + fVar198) - fVar248) * fVar167;
  auVar238._12_4_ =
       ((((float)(auVar236._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar261 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar298) * fVar220;
  auVar256._0_4_ =
       ((((float)(int)(short)uVar8 - (float)(int)(short)uVar63) * fVar261 +
        (float)(int)(short)uVar63) - fVar234) * fVar72;
  auVar256._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar144) * fVar261 + fVar144) - fVar246) * fVar103;
  auVar256._8_4_ =
       ((((float)(auVar253._8_4_ >> 0x10) - fVar199) * fVar261 + fVar199) - fVar248) * fVar167;
  auVar256._12_4_ =
       ((((float)(auVar254._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar261 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar298) * fVar220;
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar271._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar161) * fVar261 + fVar161) - fVar232) *
                fVar123,((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar261 +
                         (float)(int)(short)uVar9) - fVar222) * fVar101);
  auVar271._8_4_ =
       ((((float)(auVar268._8_4_ >> 0x10) - fVar209) * fVar261 + fVar209) - fVar233) * fVar169;
  auVar271._12_4_ =
       ((((float)(auVar269._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar261 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar251) * fVar221;
  auVar285._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar11) * fVar261 +
        (float)(int)(short)uVar11) - fVar222) * fVar101;
  auVar285._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar162) * fVar261 + fVar162) - fVar232) * fVar123;
  auVar285._8_4_ =
       ((((float)(auVar282._8_4_ >> 0x10) - fVar210) * fVar261 + fVar210) - fVar233) * fVar169;
  auVar285._12_4_ =
       ((((float)(auVar283._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar261 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar251) * fVar221;
  auVar126._8_4_ = auVar149._8_4_;
  auVar126._0_8_ = auVar149._0_8_;
  auVar126._12_4_ = auVar149._12_4_;
  auVar127 = minps(auVar126,auVar216);
  auVar113._8_4_ = auVar238._8_4_;
  auVar113._0_8_ = auVar238._0_8_;
  auVar113._12_4_ = auVar238._12_4_;
  auVar73 = minps(auVar113,auVar256);
  auVar127 = maxps(auVar127,auVar73);
  auVar114._8_4_ = auVar271._8_4_;
  auVar114._0_8_ = auVar271._0_8_;
  auVar114._12_4_ = auVar271._12_4_;
  auVar73 = minps(auVar114,auVar285);
  auVar90._4_4_ = uVar13;
  auVar90._0_4_ = uVar13;
  auVar90._8_4_ = uVar13;
  auVar90._12_4_ = uVar13;
  auVar73 = maxps(auVar73,auVar90);
  auVar73 = maxps(auVar127,auVar73);
  auVar127 = maxps(auVar149,auVar216);
  auVar239 = maxps(auVar238,auVar256);
  auVar127 = minps(auVar127,auVar239);
  local_2d8 = auVar73._0_4_ * 0.99999964;
  fStack_2d4 = auVar73._4_4_ * 0.99999964;
  fStack_2d0 = auVar73._8_4_ * 0.99999964;
  fStack_2cc = auVar73._12_4_ * 0.99999964;
  auVar73 = maxps(auVar271,auVar285);
  uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar91._4_4_ = uVar13;
  auVar91._0_4_ = uVar13;
  auVar91._8_4_ = uVar13;
  auVar91._12_4_ = uVar13;
  auVar73 = minps(auVar73,auVar91);
  auVar73 = minps(auVar127,auVar73);
  uVar66 = (uint)(byte)PVar12;
  auVar115._0_4_ = -(uint)(uVar66 != 0 && local_2d8 <= auVar73._0_4_ * 1.0000004);
  auVar115._4_4_ = -(uint)(1 < uVar66 && fStack_2d4 <= auVar73._4_4_ * 1.0000004);
  auVar115._8_4_ = -(uint)(2 < uVar66 && fStack_2d0 <= auVar73._8_4_ * 1.0000004);
  auVar115._12_4_ = -(uint)(3 < uVar66 && fStack_2cc <= auVar73._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar115);
  if (uVar66 == 0) {
    return;
  }
  uVar66 = uVar66 & 0xff;
  local_278._0_12_ = mm_lookupmask_ps._240_12_;
  local_278._12_4_ = 0;
  local_3e8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3e0 = prim;
LAB_00c37224:
  lVar19 = 0;
  if ((ulong)uVar66 != 0) {
    for (; (uVar66 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
    }
  }
  uVar67 = *(uint *)(local_3e0 + 2);
  uVar69 = *(uint *)(local_3e0 + lVar19 * 4 + 6);
  pGVar14 = (context->scene->geometries).items[uVar67].ptr;
  fVar143 = pGVar14->fnumTimeSegments;
  fVar72 = (pGVar14->time_range).lower;
  fVar101 = ((*(float *)(ray + k * 4 + 0x70) - fVar72) / ((pGVar14->time_range).upper - fVar72)) *
            fVar143;
  fVar72 = floorf(fVar101);
  fVar143 = fVar143 + -1.0;
  if (fVar143 <= fVar72) {
    fVar72 = fVar143;
  }
  fVar143 = 0.0;
  if (0.0 <= fVar72) {
    fVar143 = fVar72;
  }
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                           (ulong)uVar69 *
                           pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar64 = (long)(int)fVar143 * 0x38;
  lVar16 = *(long *)(_Var15 + lVar64);
  lVar17 = *(long *)(_Var15 + 0x10 + lVar64);
  pfVar3 = (float *)(lVar16 + lVar17 * uVar55);
  fVar72 = *pfVar3;
  fVar102 = pfVar3[1];
  fVar103 = pfVar3[2];
  fVar123 = pfVar3[3];
  lVar19 = uVar55 + 1;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar19);
  fVar124 = *pfVar3;
  fVar125 = pfVar3[1];
  fVar142 = pfVar3[2];
  fVar144 = pfVar3[3];
  lVar1 = uVar55 + 2;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar1);
  fVar161 = *pfVar3;
  fVar162 = pfVar3[1];
  fVar163 = pfVar3[2];
  fVar167 = pfVar3[3];
  lVar2 = uVar55 + 3;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar2);
  fVar169 = *pfVar3;
  fVar174 = pfVar3[1];
  fVar197 = pfVar3[2];
  fVar198 = pfVar3[3];
  lVar16 = *(long *)&pGVar14[4].fnumTimeSegments;
  lVar17 = *(long *)(lVar16 + lVar64);
  lVar18 = *(long *)(lVar16 + 0x10 + lVar64);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar55);
  fVar199 = *pfVar3;
  fVar209 = pfVar3[1];
  fVar210 = pfVar3[2];
  fVar211 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar19);
  fVar220 = *pfVar3;
  fVar221 = pfVar3[1];
  fVar234 = pfVar3[2];
  fVar246 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar248 = *pfVar3;
  fVar298 = pfVar3[1];
  fVar222 = pfVar3[2];
  fVar232 = pfVar3[3];
  fVar101 = fVar101 - fVar143;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar143 = *pfVar3;
  fVar233 = pfVar3[1];
  fVar251 = pfVar3[2];
  fVar261 = pfVar3[3];
  fVar300 = (fVar161 * 0.5 + fVar169 * 0.0 + fVar124 * 0.0) - fVar72 * 0.5;
  fVar307 = (fVar162 * 0.5 + fVar174 * 0.0 + fVar125 * 0.0) - fVar102 * 0.5;
  fVar311 = (fVar163 * 0.5 + fVar197 * 0.0 + fVar142 * 0.0) - fVar103 * 0.5;
  fVar315 = (fVar167 * 0.5 + fVar198 * 0.0 + fVar144 * 0.0) - fVar123 * 0.5;
  fVar314 = (fVar248 * 0.5 + fVar143 * 0.0 + fVar220 * 0.0) - fVar199 * 0.5;
  fVar247 = (fVar298 * 0.5 + fVar233 * 0.0 + fVar221 * 0.0) - fVar209 * 0.5;
  fVar249 = (fVar222 * 0.5 + fVar251 * 0.0 + fVar234 * 0.0) - fVar210 * 0.5;
  fVar250 = (fVar232 * 0.5 + fVar261 * 0.0 + fVar246 * 0.0) - fVar211 * 0.5;
  fVar263 = fVar161 * 0.0 + fVar169 * -0.0 + fVar124 + fVar72 * -0.0;
  fVar266 = fVar162 * 0.0 + fVar174 * -0.0 + fVar125 + fVar102 * -0.0;
  fVar275 = fVar163 * 0.0 + fVar197 * -0.0 + fVar142 + fVar103 * -0.0;
  fVar276 = fVar167 * 0.0 + fVar198 * -0.0 + fVar144 + fVar123 * -0.0;
  fVar301 = fVar248 * 0.0 + fVar143 * -0.0 + fVar220 + fVar199 * -0.0;
  fVar308 = fVar298 * 0.0 + fVar233 * -0.0 + fVar221 + fVar209 * -0.0;
  fVar312 = fVar222 * 0.0 + fVar251 * -0.0 + fVar234 + fVar210 * -0.0;
  fVar316 = fVar232 * 0.0 + fVar261 * -0.0 + fVar246 + fVar211 * -0.0;
  fVar278 = fVar169 * -0.0 + fVar161 + fVar124 * 0.0 + fVar72 * -0.0;
  fVar292 = fVar174 * -0.0 + fVar162 + fVar125 * 0.0 + fVar102 * -0.0;
  fVar299 = fVar197 * -0.0 + fVar163 + fVar142 * 0.0 + fVar103 * -0.0;
  fVar310 = fVar198 * -0.0 + fVar167 + fVar144 * 0.0 + fVar123 * -0.0;
  fVar277 = fVar72 * 0.0 + ((fVar169 * 0.5 + fVar161 * 0.0) - fVar124 * 0.5);
  fVar289 = fVar102 * 0.0 + ((fVar174 * 0.5 + fVar162 * 0.0) - fVar125 * 0.5);
  fVar295 = fVar103 * 0.0 + ((fVar197 * 0.5 + fVar163 * 0.0) - fVar142 * 0.5);
  fVar306 = fVar123 * 0.0 + ((fVar198 * 0.5 + fVar167 * 0.0) - fVar144 * 0.5);
  fVar103 = fVar143 * -0.0 + fVar248 + fVar220 * 0.0 + fVar199 * -0.0;
  fVar123 = fVar233 * -0.0 + fVar298 + fVar221 * 0.0 + fVar209 * -0.0;
  fVar124 = fVar251 * -0.0 + fVar222 + fVar234 * 0.0 + fVar210 * -0.0;
  fVar125 = fVar261 * -0.0 + fVar232 + fVar246 * 0.0 + fVar211 * -0.0;
  fVar143 = fVar199 * 0.0 + ((fVar143 * 0.5 + fVar248 * 0.0) - fVar220 * 0.5);
  fVar72 = fVar209 * 0.0 + ((fVar233 * 0.5 + fVar298 * 0.0) - fVar221 * 0.5);
  fVar102 = fVar210 * 0.0 + ((fVar251 * 0.5 + fVar222 * 0.0) - fVar234 * 0.5);
  fVar199 = fVar211 * 0.0 + ((fVar261 * 0.5 + fVar232 * 0.0) - fVar246 * 0.5);
  fVar279 = fVar307 * fVar301 - fVar308 * fVar300;
  fVar290 = fVar311 * fVar308 - fVar312 * fVar307;
  fVar293 = fVar300 * fVar312 - fVar301 * fVar311;
  fVar296 = fVar315 * fVar316 - fVar316 * fVar315;
  fVar221 = fVar307 * fVar314 - fVar247 * fVar300;
  fVar246 = fVar311 * fVar247 - fVar249 * fVar307;
  fVar248 = fVar300 * fVar249 - fVar314 * fVar311;
  fVar233 = fVar289 * fVar103 - fVar123 * fVar277;
  fVar251 = fVar295 * fVar123 - fVar124 * fVar289;
  fVar261 = fVar277 * fVar124 - fVar103 * fVar295;
  fVar312 = fVar306 * fVar125 - fVar125 * fVar306;
  fVar210 = fVar289 * fVar143 - fVar72 * fVar277;
  fVar211 = fVar295 * fVar72 - fVar102 * fVar289;
  fVar220 = fVar277 * fVar102 - fVar143 * fVar295;
  fVar198 = fVar293 * fVar293 + fVar290 * fVar290 + fVar279 * fVar279;
  auVar127 = ZEXT416((uint)fVar198);
  auVar73 = rsqrtss(ZEXT416((uint)fVar198),auVar127);
  fVar143 = auVar73._0_4_;
  fVar247 = fVar143 * 1.5 - fVar143 * fVar143 * fVar198 * 0.5 * fVar143;
  fVar222 = fVar279 * fVar221 + fVar293 * fVar248 + fVar290 * fVar246;
  fVar298 = fVar296 * fVar247;
  auVar73 = rcpss(auVar127,auVar127);
  fVar232 = (2.0 - fVar198 * auVar73._0_4_) * auVar73._0_4_;
  fVar234 = fVar261 * fVar261 + fVar251 * fVar251 + fVar233 * fVar233;
  auVar127 = ZEXT416((uint)fVar234);
  auVar73 = rsqrtss(ZEXT416((uint)fVar234),auVar127);
  fVar143 = auVar73._0_4_;
  fVar316 = fVar143 * 1.5 - fVar143 * fVar143 * fVar234 * 0.5 * fVar143;
  fVar318 = fVar233 * fVar210 + fVar261 * fVar220 + fVar251 * fVar211;
  lVar17 = *(long *)(_Var15 + 0x38 + lVar64);
  lVar18 = *(long *)(_Var15 + 0x48 + lVar64);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar55);
  fVar143 = *pfVar3;
  fVar72 = pfVar3[1];
  fVar102 = pfVar3[2];
  fVar103 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar19);
  fVar123 = *pfVar3;
  fVar124 = pfVar3[1];
  fVar125 = pfVar3[2];
  fVar142 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar144 = *pfVar3;
  fVar161 = pfVar3[1];
  fVar162 = pfVar3[2];
  fVar163 = pfVar3[3];
  auVar73 = rcpss(auVar127,auVar127);
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar167 = *pfVar3;
  fVar169 = pfVar3[1];
  fVar174 = pfVar3[2];
  fVar197 = pfVar3[3];
  fVar209 = fVar312 * fVar316;
  fVar319 = (2.0 - fVar234 * auVar73._0_4_) * auVar73._0_4_;
  fVar302 = fVar276 * fVar290 * fVar247;
  fVar309 = fVar276 * fVar293 * fVar247;
  fVar313 = fVar276 * fVar279 * fVar247;
  fVar317 = fVar276 * fVar298;
  fVar314 = fVar263 - fVar302;
  fVar249 = fVar266 - fVar309;
  fVar301 = fVar275 - fVar313;
  fVar308 = fVar276 - fVar317;
  fVar280 = fVar276 * fVar232 * (fVar198 * fVar246 - fVar222 * fVar290) * fVar247 +
            fVar315 * fVar290 * fVar247;
  fVar291 = fVar276 * fVar232 * (fVar198 * fVar248 - fVar222 * fVar293) * fVar247 +
            fVar315 * fVar293 * fVar247;
  fVar294 = fVar276 * fVar232 * (fVar198 * fVar221 - fVar222 * fVar279) * fVar247 +
            fVar315 * fVar279 * fVar247;
  fVar297 = fVar276 * fVar232 * (fVar198 * (fVar315 * fVar250 - fVar250 * fVar315) -
                                fVar222 * fVar296) * fVar247 + fVar315 * fVar298;
  fVar302 = fVar302 + fVar263;
  fVar309 = fVar309 + fVar266;
  fVar313 = fVar313 + fVar275;
  fVar317 = fVar317 + fVar276;
  fVar263 = fVar310 * fVar251 * fVar316;
  fVar266 = fVar310 * fVar261 * fVar316;
  fVar275 = fVar310 * fVar233 * fVar316;
  fVar276 = fVar310 * fVar209;
  fVar247 = fVar278 - fVar263;
  fVar250 = fVar292 - fVar266;
  fVar279 = fVar299 - fVar275;
  fVar290 = fVar310 - fVar276;
  fVar164 = fVar310 * fVar319 * (fVar234 * fVar211 - fVar318 * fVar251) * fVar316 +
            fVar306 * fVar251 * fVar316;
  fVar168 = fVar310 * fVar319 * (fVar234 * fVar220 - fVar318 * fVar261) * fVar316 +
            fVar306 * fVar261 * fVar316;
  fVar170 = fVar310 * fVar319 * (fVar234 * fVar210 - fVar318 * fVar233) * fVar316 +
            fVar306 * fVar233 * fVar316;
  fVar172 = fVar310 * fVar319 * (fVar234 * (fVar306 * fVar199 - fVar199 * fVar306) -
                                fVar318 * fVar312) * fVar316 + fVar306 * fVar209;
  fVar263 = fVar263 + fVar278;
  fVar266 = fVar266 + fVar292;
  fVar275 = fVar275 + fVar299;
  fVar276 = fVar276 + fVar310;
  fVar318 = (fVar144 * 0.5 + fVar167 * 0.0 + fVar123 * 0.0) - fVar143 * 0.5;
  fVar319 = (fVar161 * 0.5 + fVar169 * 0.0 + fVar124 * 0.0) - fVar72 * 0.5;
  fVar171 = (fVar162 * 0.5 + fVar174 * 0.0 + fVar125 * 0.0) - fVar102 * 0.5;
  fVar173 = (fVar163 * 0.5 + fVar197 * 0.0 + fVar142 * 0.0) - fVar103 * 0.5;
  lVar17 = *(long *)(lVar16 + 0x38 + lVar64);
  lVar16 = *(long *)(lVar16 + 0x48 + lVar64);
  pRVar61 = (RTCIntersectArguments *)(lVar19 * lVar16);
  pfVar3 = (float *)(lVar17 + lVar16 * lVar2);
  fVar198 = *pfVar3;
  fVar199 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar1 * lVar16);
  fVar211 = *pfVar3;
  fVar220 = pfVar3[1];
  fVar221 = pfVar3[2];
  fVar234 = pfVar3[3];
  pfVar3 = (float *)((long)&pRVar61->flags + lVar17);
  fVar246 = *pfVar3;
  fVar248 = pfVar3[1];
  fVar298 = pfVar3[2];
  fVar222 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + uVar55 * lVar16);
  fVar232 = *pfVar3;
  fVar233 = pfVar3[1];
  fVar251 = pfVar3[2];
  fVar261 = pfVar3[3];
  fVar252 = (fVar211 * 0.5 + fVar198 * 0.0 + fVar246 * 0.0) - fVar232 * 0.5;
  fVar262 = (fVar220 * 0.5 + fVar199 * 0.0 + fVar248 * 0.0) - fVar233 * 0.5;
  fVar264 = (fVar221 * 0.5 + fVar209 * 0.0 + fVar298 * 0.0) - fVar251 * 0.5;
  fVar265 = (fVar234 * 0.5 + fVar210 * 0.0 + fVar222 * 0.0) - fVar261 * 0.5;
  fVar312 = fVar144 * 0.0 + fVar167 * -0.0 + fVar123 + fVar143 * -0.0;
  fVar316 = fVar161 * 0.0 + fVar169 * -0.0 + fVar124 + fVar72 * -0.0;
  fVar293 = fVar162 * 0.0 + fVar174 * -0.0 + fVar125 + fVar102 * -0.0;
  fVar296 = fVar163 * 0.0 + fVar197 * -0.0 + fVar142 + fVar103 * -0.0;
  fVar278 = fVar167 * -0.0 + fVar144 + fVar123 * 0.0 + fVar143 * -0.0;
  fVar292 = fVar169 * -0.0 + fVar161 + fVar124 * 0.0 + fVar72 * -0.0;
  fVar299 = fVar174 * -0.0 + fVar162 + fVar125 * 0.0 + fVar102 * -0.0;
  fVar310 = fVar197 * -0.0 + fVar163 + fVar142 * 0.0 + fVar103 * -0.0;
  fVar143 = fVar143 * 0.0 + ((fVar167 * 0.5 + fVar144 * 0.0) - fVar123 * 0.5);
  fVar72 = fVar72 * 0.0 + ((fVar169 * 0.5 + fVar161 * 0.0) - fVar124 * 0.5);
  fVar102 = fVar102 * 0.0 + ((fVar174 * 0.5 + fVar162 * 0.0) - fVar125 * 0.5);
  fVar103 = fVar103 * 0.0 + ((fVar197 * 0.5 + fVar163 * 0.0) - fVar142 * 0.5);
  fVar123 = fVar211 * 0.0 + fVar198 * -0.0 + fVar246 + fVar232 * -0.0;
  fVar144 = fVar220 * 0.0 + fVar199 * -0.0 + fVar248 + fVar233 * -0.0;
  fVar161 = fVar221 * 0.0 + fVar209 * -0.0 + fVar298 + fVar251 * -0.0;
  fVar162 = fVar234 * 0.0 + fVar210 * -0.0 + fVar222 + fVar261 * -0.0;
  fVar124 = fVar198 * -0.0 + fVar211 + fVar246 * 0.0 + fVar232 * -0.0;
  fVar125 = fVar199 * -0.0 + fVar220 + fVar248 * 0.0 + fVar233 * -0.0;
  fVar142 = fVar209 * -0.0 + fVar221 + fVar298 * 0.0 + fVar251 * -0.0;
  fVar163 = fVar210 * -0.0 + fVar234 + fVar222 * 0.0 + fVar261 * -0.0;
  fVar167 = fVar232 * 0.0 + ((fVar198 * 0.5 + fVar211 * 0.0) - fVar246 * 0.5);
  fVar197 = fVar233 * 0.0 + ((fVar199 * 0.5 + fVar220 * 0.0) - fVar248 * 0.5);
  fVar198 = fVar251 * 0.0 + ((fVar209 * 0.5 + fVar221 * 0.0) - fVar298 * 0.5);
  fVar232 = fVar261 * 0.0 + ((fVar210 * 0.5 + fVar234 * 0.0) - fVar222 * 0.5);
  fVar199 = fVar319 * fVar123 - fVar144 * fVar318;
  fVar210 = fVar171 * fVar144 - fVar161 * fVar319;
  fVar220 = fVar318 * fVar161 - fVar123 * fVar171;
  fVar234 = fVar173 * fVar162 - fVar162 * fVar173;
  fVar123 = fVar319 * fVar252 - fVar262 * fVar318;
  fVar169 = fVar171 * fVar262 - fVar264 * fVar319;
  fVar174 = fVar318 * fVar264 - fVar252 * fVar171;
  fVar144 = fVar72 * fVar124 - fVar125 * fVar143;
  fVar161 = fVar102 * fVar125 - fVar142 * fVar72;
  fVar162 = fVar143 * fVar142 - fVar124 * fVar102;
  fVar163 = fVar103 * fVar163 - fVar163 * fVar103;
  fVar124 = fVar72 * fVar167 - fVar197 * fVar143;
  fVar125 = fVar102 * fVar197 - fVar198 * fVar72;
  fVar142 = fVar143 * fVar198 - fVar167 * fVar102;
  fVar198 = fVar220 * fVar220 + fVar210 * fVar210 + fVar199 * fVar199;
  auVar73 = ZEXT416((uint)fVar198);
  auVar127 = rsqrtss(ZEXT416((uint)fVar198),auVar73);
  fVar167 = auVar127._0_4_;
  fVar209 = fVar167 * 1.5 - fVar167 * fVar167 * fVar198 * 0.5 * fVar167;
  fVar252 = fVar199 * fVar123 + fVar220 * fVar174 + fVar210 * fVar169;
  auVar73 = rcpss(auVar73,auVar73);
  fVar167 = (2.0 - fVar198 * auVar73._0_4_) * auVar73._0_4_;
  fVar197 = fVar234 * fVar209;
  fVar233 = fVar162 * fVar162 + fVar161 * fVar161 + fVar144 * fVar144;
  auVar73 = ZEXT416((uint)fVar233);
  auVar127 = rsqrtss(ZEXT416((uint)fVar233),auVar73);
  fVar211 = auVar127._0_4_;
  fVar261 = fVar211 * 1.5 - fVar211 * fVar211 * fVar233 * 0.5 * fVar211;
  fVar262 = fVar144 * fVar124 + fVar162 * fVar142 + fVar161 * fVar125;
  auVar73 = rcpss(auVar73,auVar73);
  fVar264 = (2.0 - fVar233 * auVar73._0_4_) * auVar73._0_4_;
  fVar251 = fVar163 * fVar261;
  fVar246 = fVar296 * fVar210 * fVar209;
  fVar248 = fVar296 * fVar220 * fVar209;
  fVar298 = fVar296 * fVar199 * fVar209;
  fVar222 = fVar296 * fVar197;
  fVar211 = fVar296 * fVar167 * (fVar198 * fVar169 - fVar252 * fVar210) * fVar209 +
            fVar173 * fVar210 * fVar209;
  fVar220 = fVar296 * fVar167 * (fVar198 * fVar174 - fVar252 * fVar220) * fVar209 +
            fVar173 * fVar220 * fVar209;
  fVar221 = fVar296 * fVar167 * (fVar198 * fVar123 - fVar252 * fVar199) * fVar209 +
            fVar173 * fVar199 * fVar209;
  fVar234 = fVar296 * fVar167 * (fVar198 * (fVar173 * fVar265 - fVar265 * fVar173) -
                                fVar252 * fVar234) * fVar209 + fVar173 * fVar197;
  fVar167 = fVar312 - fVar246;
  fVar169 = fVar316 - fVar248;
  fVar174 = fVar293 - fVar298;
  fVar197 = fVar296 - fVar222;
  fVar246 = fVar246 + fVar312;
  fVar248 = fVar248 + fVar316;
  fVar298 = fVar298 + fVar293;
  fVar222 = fVar222 + fVar296;
  fVar123 = fVar310 * fVar161 * fVar261;
  fVar199 = fVar310 * fVar162 * fVar261;
  fVar209 = fVar310 * fVar144 * fVar261;
  fVar210 = fVar310 * fVar251;
  fVar312 = fVar310 * fVar264 * (fVar233 * fVar125 - fVar262 * fVar161) * fVar261 +
            fVar103 * fVar161 * fVar261;
  fVar316 = fVar310 * fVar264 * (fVar233 * fVar142 - fVar262 * fVar162) * fVar261 +
            fVar103 * fVar162 * fVar261;
  fVar293 = fVar310 * fVar264 * (fVar233 * fVar124 - fVar262 * fVar144) * fVar261 +
            fVar103 * fVar144 * fVar261;
  fVar296 = fVar310 * fVar264 * (fVar233 * (fVar103 * fVar232 - fVar232 * fVar103) -
                                fVar262 * fVar163) * fVar261 + fVar103 * fVar251;
  fVar124 = fVar278 - fVar123;
  fVar125 = fVar292 - fVar199;
  fVar142 = fVar299 - fVar209;
  fVar144 = fVar310 - fVar210;
  fVar123 = fVar123 + fVar278;
  fVar199 = fVar199 + fVar292;
  fVar209 = fVar209 + fVar299;
  fVar210 = fVar210 + fVar310;
  fVar292 = 1.0 - fVar101;
  fVar299 = fVar314 * fVar292 + fVar167 * fVar101;
  fVar310 = fVar249 * fVar292 + fVar169 * fVar101;
  fVar252 = fVar301 * fVar292 + fVar174 * fVar101;
  fVar262 = fVar308 * fVar292 + fVar197 * fVar101;
  fVar314 = ((fVar300 - fVar280) * 0.33333334 + fVar314) * fVar292 +
            ((fVar318 - fVar211) * 0.33333334 + fVar167) * fVar101;
  fVar249 = ((fVar307 - fVar291) * 0.33333334 + fVar249) * fVar292 +
            ((fVar319 - fVar220) * 0.33333334 + fVar169) * fVar101;
  fVar301 = ((fVar311 - fVar294) * 0.33333334 + fVar301) * fVar292 +
            ((fVar171 - fVar221) * 0.33333334 + fVar174) * fVar101;
  fVar308 = ((fVar315 - fVar297) * 0.33333334 + fVar308) * fVar292 +
            ((fVar173 - fVar234) * 0.33333334 + fVar197) * fVar101;
  fVar232 = (fVar247 - (fVar277 - fVar164) * 0.33333334) * fVar292 +
            (fVar124 - (fVar143 - fVar312) * 0.33333334) * fVar101;
  fVar233 = (fVar250 - (fVar289 - fVar168) * 0.33333334) * fVar292 +
            (fVar125 - (fVar72 - fVar316) * 0.33333334) * fVar101;
  fVar251 = (fVar279 - (fVar295 - fVar170) * 0.33333334) * fVar292 +
            (fVar142 - (fVar102 - fVar293) * 0.33333334) * fVar101;
  fVar261 = (fVar290 - (fVar306 - fVar172) * 0.33333334) * fVar292 +
            (fVar144 - (fVar103 - fVar296) * 0.33333334) * fVar101;
  fVar161 = fVar247 * fVar292 + fVar124 * fVar101;
  fVar163 = fVar250 * fVar292 + fVar125 * fVar101;
  fVar169 = fVar279 * fVar292 + fVar142 * fVar101;
  fVar197 = fVar290 * fVar292 + fVar144 * fVar101;
  fVar162 = fVar302 * fVar292 + fVar246 * fVar101;
  fVar167 = fVar309 * fVar292 + fVar248 * fVar101;
  fVar174 = fVar313 * fVar292 + fVar298 * fVar101;
  fVar198 = fVar317 * fVar292 + fVar222 * fVar101;
  fVar246 = ((fVar280 + fVar300) * 0.33333334 + fVar302) * fVar292 +
            ((fVar211 + fVar318) * 0.33333334 + fVar246) * fVar101;
  fVar248 = ((fVar291 + fVar307) * 0.33333334 + fVar309) * fVar292 +
            ((fVar220 + fVar319) * 0.33333334 + fVar248) * fVar101;
  fVar278 = ((fVar294 + fVar311) * 0.33333334 + fVar313) * fVar292 +
            ((fVar221 + fVar171) * 0.33333334 + fVar298) * fVar101;
  fVar222 = ((fVar297 + fVar315) * 0.33333334 + fVar317) * fVar292 +
            ((fVar234 + fVar173) * 0.33333334 + fVar222) * fVar101;
  fVar124 = (fVar263 - (fVar164 + fVar277) * 0.33333334) * fVar292 +
            (fVar123 - (fVar312 + fVar143) * 0.33333334) * fVar101;
  fVar125 = (fVar266 - (fVar168 + fVar289) * 0.33333334) * fVar292 +
            (fVar199 - (fVar316 + fVar72) * 0.33333334) * fVar101;
  fVar142 = (fVar275 - (fVar170 + fVar295) * 0.33333334) * fVar292 +
            (fVar209 - (fVar293 + fVar102) * 0.33333334) * fVar101;
  fVar144 = (fVar276 - (fVar172 + fVar306) * 0.33333334) * fVar292 +
            (fVar210 - (fVar296 + fVar103) * 0.33333334) * fVar101;
  local_288 = fVar292 * fVar263 + fVar101 * fVar123;
  fStack_284 = fVar292 * fVar266 + fVar101 * fVar199;
  fStack_280 = fVar292 * fVar275 + fVar101 * fVar209;
  fStack_27c = fVar292 * fVar276 + fVar101 * fVar210;
  local_1c8 = *(float *)(ray + k * 4);
  fStack_1c4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1c0 = *(float *)(ray + k * 4 + 0x20);
  local_158 = fVar299 - local_1c8;
  fStack_154 = fVar310 - fStack_1c4;
  fStack_150 = fVar252 - fStack_1c0;
  fStack_14c = fVar262 - 0.0;
  fVar143 = pre->ray_space[k].vx.field_0.m128[0];
  fVar72 = pre->ray_space[k].vx.field_0.m128[1];
  fVar101 = pre->ray_space[k].vy.field_0.m128[0];
  fVar102 = pre->ray_space[k].vy.field_0.m128[1];
  fVar103 = pre->ray_space[k].vz.field_0.m128[0];
  fVar123 = pre->ray_space[k].vz.field_0.m128[1];
  fVar199 = local_158 * fVar143 + fStack_154 * fVar101 + fStack_150 * fVar103;
  fVar210 = local_158 * fVar72 + fStack_154 * fVar102 + fStack_150 * fVar123;
  local_168 = fVar314 - local_1c8;
  fStack_164 = fVar249 - fStack_1c4;
  fStack_160 = fVar301 - fStack_1c0;
  fStack_15c = fVar308 - 0.0;
  fVar220 = local_168 * fVar143 + fStack_164 * fVar101 + fStack_160 * fVar103;
  fVar221 = local_168 * fVar72 + fStack_164 * fVar102 + fStack_160 * fVar123;
  local_318 = CONCAT44(fVar221,fVar220);
  local_178 = fVar232 - local_1c8;
  fStack_174 = fVar233 - fStack_1c4;
  fStack_170 = fVar251 - fStack_1c0;
  fStack_16c = fVar261 - 0.0;
  fVar234 = local_178 * fVar143 + fStack_174 * fVar101 + fStack_170 * fVar103;
  fVar298 = local_178 * fVar72 + fStack_174 * fVar102 + fStack_170 * fVar123;
  local_328 = CONCAT44(fVar298,fVar234);
  local_188 = fVar161 - local_1c8;
  fStack_184 = fVar163 - fStack_1c4;
  fStack_180 = fVar169 - fStack_1c0;
  fStack_17c = fVar197 - 0.0;
  fVar209 = local_188 * fVar143 + fStack_184 * fVar101 + fStack_180 * fVar103;
  fVar211 = local_188 * fVar72 + fStack_184 * fVar102 + fStack_180 * fVar123;
  local_338 = CONCAT44(fVar211,fVar209);
  local_198 = fVar162 - local_1c8;
  fStack_194 = fVar167 - fStack_1c4;
  fStack_190 = fVar174 - fStack_1c0;
  fStack_18c = fVar198 - 0.0;
  fVar263 = local_198 * fVar143 + fStack_194 * fVar101 + fStack_190 * fVar103;
  fVar266 = local_198 * fVar72 + fStack_194 * fVar102 + fStack_190 * fVar123;
  local_348 = CONCAT44(fVar266,fVar263);
  local_1a8 = fVar246 - local_1c8;
  fStack_1a4 = fVar248 - fStack_1c4;
  fStack_1a0 = fVar278 - fStack_1c0;
  fStack_19c = fVar222 - 0.0;
  fVar275 = local_1a8 * fVar143 + fStack_1a4 * fVar101 + fStack_1a0 * fVar103;
  fVar276 = local_1a8 * fVar72 + fStack_1a4 * fVar102 + fStack_1a0 * fVar123;
  local_358 = CONCAT44(fVar276,fVar275);
  local_1b8 = fVar124 - local_1c8;
  fStack_1b4 = fVar125 - fStack_1c4;
  fStack_1b0 = fVar142 - fStack_1c0;
  fStack_1ac = fVar144 - 0.0;
  fVar277 = local_1b8 * fVar143 + fStack_1b4 * fVar101 + fStack_1b0 * fVar103;
  fVar289 = local_1b8 * fVar72 + fStack_1b4 * fVar102 + fStack_1b0 * fVar123;
  local_368 = CONCAT44(fVar289,fVar277);
  local_1c8 = local_288 - local_1c8;
  fStack_1c4 = fStack_284 - fStack_1c4;
  fStack_1c0 = fStack_280 - fStack_1c0;
  fStack_1bc = fStack_27c - 0.0;
  fVar101 = local_1c8 * fVar143 + fStack_1c4 * fVar101 + fStack_1c0 * fVar103;
  fVar72 = local_1c8 * fVar72 + fStack_1c4 * fVar102 + fStack_1c0 * fVar123;
  local_378 = CONCAT44(fVar72,fVar101);
  auVar150._8_8_ = local_358;
  auVar150._0_8_ = local_318;
  register0x00001488 = local_378;
  local_148 = local_338;
  auVar92._8_4_ = fVar263;
  auVar92._0_8_ = CONCAT44(fVar210,fVar199);
  auVar92._12_4_ = fVar266;
  auVar73 = minps(auVar92,auVar150);
  auVar116._8_4_ = fVar277;
  auVar116._0_8_ = local_328;
  auVar116._12_4_ = fVar289;
  auVar127 = minps(auVar116,_local_148);
  auVar73 = minps(auVar73,auVar127);
  auVar117._8_4_ = fVar263;
  auVar117._0_8_ = CONCAT44(fVar210,fVar199);
  auVar117._12_4_ = fVar266;
  auVar127 = maxps(auVar117,auVar150);
  auVar128._4_4_ = fVar298;
  auVar128._0_4_ = fVar234;
  auVar128._8_4_ = fVar277;
  auVar128._12_4_ = fVar289;
  auVar129 = maxps(auVar128,_local_148);
  auVar239 = maxps(auVar127,auVar129);
  auVar20._4_8_ = auVar129._8_8_;
  auVar20._0_4_ = auVar73._4_4_;
  auVar130._0_8_ = auVar20._0_8_ << 0x20;
  auVar130._8_4_ = auVar73._8_4_;
  auVar130._12_4_ = auVar73._12_4_;
  auVar131._8_8_ = auVar73._8_8_;
  auVar131._0_8_ = auVar130._8_8_;
  auVar127 = minps(auVar73,auVar131);
  auVar21._4_8_ = auVar73._8_8_;
  auVar21._0_4_ = auVar239._4_4_;
  auVar132._0_8_ = auVar21._0_8_ << 0x20;
  auVar132._8_4_ = auVar239._8_4_;
  auVar132._12_4_ = auVar239._12_4_;
  auVar133._8_8_ = auVar239._8_8_;
  auVar133._0_8_ = auVar132._8_8_;
  auVar73 = maxps(auVar239,auVar133);
  auVar93._0_8_ = auVar127._0_8_ & 0x7fffffff7fffffff;
  auVar93._8_4_ = auVar127._8_4_ & 0x7fffffff;
  auVar93._12_4_ = auVar127._12_4_ & 0x7fffffff;
  auVar118._0_8_ = auVar73._0_8_ & 0x7fffffff7fffffff;
  auVar118._8_4_ = auVar73._8_4_ & 0x7fffffff;
  auVar118._12_4_ = auVar73._12_4_ & 0x7fffffff;
  auVar73 = maxps(auVar93,auVar118);
  fVar143 = auVar73._4_4_;
  if (auVar73._4_4_ <= auVar73._0_4_) {
    fVar143 = auVar73._0_4_;
  }
  local_3d0 = (ulong)uVar66 + 0xf;
  fVar143 = fVar143 * 9.536743e-07;
  local_258 = fVar143;
  fStack_254 = fVar143;
  fStack_250 = fVar143;
  fStack_24c = fVar143;
  local_268 = -fVar143;
  fStack_264 = -fVar143;
  fStack_260 = -fVar143;
  fStack_25c = -fVar143;
  local_118 = fVar220 - fVar199;
  fStack_114 = fVar221 - fVar210;
  fStack_110 = fVar275 - fVar263;
  fStack_10c = fVar276 - fVar266;
  local_128 = fVar234 - fVar220;
  fStack_124 = fVar298 - fVar221;
  fStack_120 = fVar277 - fVar275;
  fStack_11c = fVar289 - fVar276;
  local_138 = fVar209 - fVar234;
  fStack_134 = fVar211 - fVar298;
  fStack_130 = fVar101 - fVar277;
  fStack_12c = fVar72 - fVar289;
  local_298 = fVar162 - fVar299;
  fStack_294 = fVar167 - fVar310;
  fStack_290 = fVar174 - fVar252;
  fStack_28c = fVar198 - fVar262;
  local_2a8 = fVar246 - fVar314;
  fStack_2a4 = fVar248 - fVar249;
  fStack_2a0 = fVar278 - fVar301;
  fStack_29c = fVar222 - fVar308;
  local_2b8 = fVar124 - fVar232;
  fStack_2b4 = fVar125 - fVar233;
  fStack_2b0 = fVar142 - fVar251;
  fStack_2ac = fVar144 - fVar261;
  local_2c8 = local_288 - fVar161;
  fStack_2c4 = fStack_284 - fVar163;
  fStack_2c0 = fStack_280 - fVar169;
  fStack_2bc = fStack_27c - fVar197;
  local_2e8 = uVar67;
  uStack_2e4 = uVar67;
  uStack_2e0 = uVar67;
  uStack_2dc = uVar67;
  local_2f8 = uVar69;
  uStack_2f4 = uVar69;
  uStack_2f0 = uVar69;
  uStack_2ec = uVar69;
  uVar55 = 0;
  fVar72 = *(float *)(ray + k * 4 + 0x30);
  local_538 = 0x3f80000000000000;
  local_528 = 0x3f80000000000000;
  local_3d8 = (ulong)uVar69;
  uStack_370 = local_378;
  uStack_360 = local_368;
  uStack_350 = local_358;
  uStack_340 = local_348;
  uStack_330 = local_338;
  uStack_320 = local_328;
  uStack_310 = local_318;
  do {
    fVar101 = 1.0 - (float)local_538;
    fVar102 = 1.0 - (float)local_538;
    fVar103 = 1.0 - local_538._4_4_;
    fVar123 = 1.0 - local_538._4_4_;
    fVar125 = fVar199 * fVar101 + (float)local_348 * (float)local_538;
    fVar144 = fVar210 * fVar102 + local_348._4_4_ * (float)local_538;
    fVar306 = fVar199 * fVar103 + (float)uStack_340 * local_538._4_4_;
    fVar250 = fVar210 * fVar123 + uStack_340._4_4_ * local_538._4_4_;
    fVar211 = (float)local_318 * fVar101 + (float)local_358 * (float)local_538;
    fVar292 = local_318._4_4_ * fVar102 + local_358._4_4_ * (float)local_538;
    fVar290 = (float)uStack_310 * fVar103 + (float)uStack_350 * local_538._4_4_;
    fVar318 = uStack_310._4_4_ * fVar123 + uStack_350._4_4_ * local_538._4_4_;
    fVar312 = (float)local_328 * fVar101 + (float)local_368 * (float)local_538;
    fVar316 = local_328._4_4_ * fVar102 + local_368._4_4_ * (float)local_538;
    fVar168 = (float)uStack_320 * fVar103 + (float)uStack_360 * local_538._4_4_;
    fVar171 = uStack_320._4_4_ * fVar123 + uStack_360._4_4_ * local_538._4_4_;
    fVar293 = fVar101 * (float)local_338 + (float)local_538 * (float)local_378;
    fVar296 = fVar102 * local_338._4_4_ + (float)local_538 * local_378._4_4_;
    fVar297 = fVar103 * (float)uStack_330 + local_538._4_4_ * (float)uStack_370;
    fVar300 = fVar123 * uStack_330._4_4_ + local_538._4_4_ * uStack_370._4_4_;
    fVar101 = (local_528._4_4_ - (float)local_528) * 0.11111111;
    fVar172 = (local_528._4_4_ - (float)local_528) * 0.0 + (float)local_528;
    fVar173 = (local_528._4_4_ - (float)local_528) * 0.33333334 + (float)local_528;
    fVar262 = (local_528._4_4_ - (float)local_528) * 0.6666667 + (float)local_528;
    fVar264 = (local_528._4_4_ - (float)local_528) * 1.0 + (float)local_528;
    fVar265 = 1.0 - fVar172;
    fVar280 = 1.0 - fVar173;
    fVar291 = 1.0 - fVar262;
    fVar294 = 1.0 - fVar264;
    fVar124 = fVar211 * fVar265 + fVar312 * fVar172;
    fVar197 = fVar211 * fVar280 + fVar312 * fVar173;
    fVar198 = fVar211 * fVar291 + fVar312 * fVar262;
    fVar209 = fVar211 * fVar294 + fVar312 * fVar264;
    fVar295 = fVar292 * fVar265 + fVar316 * fVar172;
    fVar247 = fVar292 * fVar280 + fVar316 * fVar173;
    fVar279 = fVar292 * fVar291 + fVar316 * fVar262;
    fVar308 = fVar292 * fVar294 + fVar316 * fVar264;
    fVar102 = (fVar125 * fVar265 + fVar211 * fVar172) * fVar265 + fVar172 * fVar124;
    fVar103 = (fVar125 * fVar280 + fVar211 * fVar173) * fVar280 + fVar173 * fVar197;
    fVar123 = (fVar125 * fVar291 + fVar211 * fVar262) * fVar291 + fVar262 * fVar198;
    fVar125 = (fVar125 * fVar294 + fVar211 * fVar264) * fVar294 + fVar264 * fVar209;
    fVar211 = (fVar144 * fVar265 + fVar292 * fVar172) * fVar265 + fVar172 * fVar295;
    fVar222 = (fVar144 * fVar280 + fVar292 * fVar173) * fVar280 + fVar173 * fVar247;
    fVar261 = (fVar144 * fVar291 + fVar292 * fVar262) * fVar291 + fVar262 * fVar279;
    fVar292 = (fVar144 * fVar294 + fVar292 * fVar264) * fVar294 + fVar264 * fVar308;
    fVar144 = fVar124 * fVar265 + (fVar312 * fVar265 + fVar293 * fVar172) * fVar172;
    fVar124 = fVar197 * fVar280 + (fVar312 * fVar280 + fVar293 * fVar173) * fVar173;
    fVar197 = fVar198 * fVar291 + (fVar312 * fVar291 + fVar293 * fVar262) * fVar262;
    fVar198 = fVar209 * fVar294 + (fVar312 * fVar294 + fVar293 * fVar264) * fVar264;
    fVar209 = fVar295 * fVar265 + (fVar316 * fVar265 + fVar296 * fVar172) * fVar172;
    fVar295 = fVar247 * fVar280 + (fVar316 * fVar280 + fVar296 * fVar173) * fVar173;
    fVar247 = fVar279 * fVar291 + (fVar316 * fVar291 + fVar296 * fVar262) * fVar262;
    fVar279 = fVar308 * fVar294 + (fVar316 * fVar294 + fVar296 * fVar264) * fVar264;
    local_398 = fVar265 * fVar102 + fVar172 * fVar144;
    fStack_394 = fVar280 * fVar103 + fVar173 * fVar124;
    fStack_390 = fVar291 * fVar123 + fVar262 * fVar197;
    fStack_38c = fVar294 * fVar125 + fVar264 * fVar198;
    local_388 = fVar265 * fVar211 + fVar172 * fVar209;
    fStack_384 = fVar280 * fVar222 + fVar173 * fVar295;
    fStack_380 = fVar291 * fVar261 + fVar262 * fVar247;
    fStack_37c = fVar294 * fVar292 + fVar264 * fVar279;
    fVar103 = (fVar124 - fVar103) * 3.0 * fVar101;
    fVar124 = (fVar197 - fVar123) * 3.0 * fVar101;
    fVar125 = (fVar198 - fVar125) * 3.0 * fVar101;
    fVar197 = (fVar295 - fVar222) * 3.0 * fVar101;
    fVar198 = (fVar247 - fVar261) * 3.0 * fVar101;
    fVar292 = (fVar279 - fVar292) * 3.0 * fVar101;
    local_1f8._4_4_ = fStack_390;
    local_1f8._0_4_ = fStack_394;
    local_1d8._4_4_ = fStack_380;
    local_1d8._0_4_ = fStack_384;
    fVar222 = local_398 + (fVar144 - fVar102) * 3.0 * fVar101;
    fVar261 = fStack_394 + fVar103;
    fVar295 = fStack_390 + fVar124;
    fVar247 = fStack_38c + fVar125;
    fVar102 = local_388 + (fVar209 - fVar211) * 3.0 * fVar101;
    fVar123 = fStack_384 + fVar197;
    fStack_540 = fStack_380 + fVar198;
    fStack_53c = fStack_37c + fVar292;
    fVar103 = fStack_394 - fVar103;
    fVar124 = fStack_390 - fVar124;
    fVar125 = fStack_38c - fVar125;
    local_1d8._8_4_ = fStack_37c;
    local_1d8._12_4_ = 0;
    local_1e8._0_4_ = fStack_384 - fVar197;
    local_1e8._4_4_ = fStack_380 - fVar198;
    local_1e8._8_4_ = fStack_37c - fVar292;
    local_1e8._12_4_ = 0;
    fVar144 = fVar290 * fVar265 + fVar168 * fVar172;
    fVar197 = fVar290 * fVar280 + fVar168 * fVar173;
    fVar198 = fVar290 * fVar291 + fVar168 * fVar262;
    fVar209 = fVar290 * fVar294 + fVar168 * fVar264;
    fVar211 = fVar318 * fVar265 + fVar171 * fVar172;
    fVar292 = fVar318 * fVar280 + fVar171 * fVar173;
    fVar319 = fVar318 * fVar291 + fVar171 * fVar262;
    fVar170 = fVar318 * fVar294 + fVar171 * fVar264;
    fVar316 = (fVar306 * fVar265 + fVar290 * fVar172) * fVar265 + fVar172 * fVar144;
    fVar293 = (fVar306 * fVar280 + fVar290 * fVar173) * fVar280 + fVar173 * fVar197;
    fVar296 = (fVar306 * fVar291 + fVar290 * fVar262) * fVar291 + fVar262 * fVar198;
    fVar164 = (fVar306 * fVar294 + fVar290 * fVar264) * fVar294 + fVar264 * fVar209;
    fVar312 = (fVar250 * fVar265 + fVar318 * fVar172) * fVar265 + fVar172 * fVar211;
    fVar279 = (fVar250 * fVar280 + fVar318 * fVar173) * fVar280 + fVar173 * fVar292;
    fVar308 = (fVar250 * fVar291 + fVar318 * fVar262) * fVar291 + fVar262 * fVar319;
    fVar290 = (fVar250 * fVar294 + fVar318 * fVar264) * fVar294 + fVar264 * fVar170;
    fVar144 = fVar144 * fVar265 + (fVar168 * fVar265 + fVar297 * fVar172) * fVar172;
    fVar197 = fVar197 * fVar280 + (fVar168 * fVar280 + fVar297 * fVar173) * fVar173;
    fVar198 = fVar198 * fVar291 + (fVar168 * fVar291 + fVar297 * fVar262) * fVar262;
    fVar209 = fVar209 * fVar294 + (fVar168 * fVar294 + fVar297 * fVar264) * fVar264;
    fVar318 = fVar211 * fVar265 + (fVar171 * fVar265 + fVar300 * fVar172) * fVar172;
    fVar168 = fVar292 * fVar280 + (fVar171 * fVar280 + fVar300 * fVar173) * fVar173;
    fVar319 = fVar319 * fVar291 + (fVar171 * fVar291 + fVar300 * fVar262) * fVar262;
    fVar170 = fVar170 * fVar294 + (fVar171 * fVar294 + fVar300 * fVar264) * fVar264;
    fVar211 = fVar265 * fVar316 + fVar172 * fVar144;
    fVar292 = fVar280 * fVar293 + fVar173 * fVar197;
    fVar306 = fVar291 * fVar296 + fVar262 * fVar198;
    fVar250 = fVar294 * fVar164 + fVar264 * fVar209;
    fVar171 = fVar265 * fVar312 + fVar172 * fVar318;
    fVar172 = fVar280 * fVar279 + fVar173 * fVar168;
    fVar173 = fVar291 * fVar308 + fVar262 * fVar319;
    fVar262 = fVar294 * fVar290 + fVar264 * fVar170;
    fVar197 = (fVar197 - fVar293) * 3.0 * fVar101;
    fVar198 = (fVar198 - fVar296) * 3.0 * fVar101;
    fVar209 = (fVar209 - fVar164) * 3.0 * fVar101;
    fVar293 = (fVar168 - fVar279) * 3.0 * fVar101;
    fVar296 = (fVar319 - fVar308) * 3.0 * fVar101;
    fVar164 = (fVar170 - fVar290) * 3.0 * fVar101;
    local_208._4_4_ = fVar306;
    local_208._0_4_ = fVar292;
    local_208._8_4_ = fVar250;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar173;
    local_228._0_4_ = fVar172;
    local_228._8_4_ = fVar262;
    local_228._12_4_ = 0;
    fVar144 = fVar211 + (fVar144 - fVar316) * 3.0 * fVar101;
    fVar279 = fVar292 + fVar197;
    fVar308 = fVar306 + fVar198;
    fVar290 = fVar250 + fVar209;
    local_218 = fVar171 + (fVar318 - fVar312) * 3.0 * fVar101;
    fStack_214 = fVar172 + fVar293;
    fStack_210 = fVar173 + fVar296;
    fStack_20c = fVar262 + fVar164;
    local_248._0_4_ = fVar292 - fVar197;
    local_248._4_4_ = fVar306 - fVar198;
    local_248._8_4_ = fVar250 - fVar209;
    local_248._12_4_ = 0;
    local_238._0_4_ = fVar172 - fVar293;
    local_238._4_4_ = fVar173 - fVar296;
    local_238._8_4_ = fVar262 - fVar164;
    local_238._12_4_ = 0;
    local_1f8._8_4_ = fStack_38c;
    local_1f8._12_4_ = 0;
    fVar312 = (fVar292 - fStack_394) + (fVar211 - local_398);
    fVar316 = (fVar306 - fStack_390) + (fVar292 - fStack_394);
    fVar293 = (fVar250 - fStack_38c) + (fVar306 - fStack_390);
    fVar296 = (fVar250 - fStack_38c) + 0.0;
    fVar101 = (fVar172 - fStack_384) + (fVar171 - local_388);
    fVar197 = (fVar173 - fStack_380) + (fVar172 - fStack_384);
    fVar198 = (fVar262 - fStack_37c) + (fVar173 - fStack_380);
    fVar209 = (fVar262 - fStack_37c) + 0.0;
    auVar191._0_8_ =
         CONCAT44(fStack_384 * fVar316 - fStack_394 * fVar197,
                  local_388 * fVar312 - local_398 * fVar101);
    auVar191._8_4_ = fStack_380 * fVar293 - fStack_390 * fVar198;
    auVar191._12_4_ = fStack_37c * fVar296 - fStack_38c * fVar209;
    auVar134._0_4_ = fVar102 * fVar312 - fVar222 * fVar101;
    auVar134._4_4_ = fVar123 * fVar316 - fVar261 * fVar197;
    auVar134._8_4_ = fStack_540 * fVar293 - fVar295 * fVar198;
    auVar134._12_4_ = fStack_53c * fVar296 - fVar247 * fVar209;
    auVar151._0_8_ =
         CONCAT44(local_1e8._4_4_ * fVar316 - fVar197 * fVar124,
                  local_1e8._0_4_ * fVar312 - fVar101 * fVar103);
    auVar151._8_4_ = local_1e8._8_4_ * fVar293 - fVar198 * fVar125;
    auVar151._12_4_ = fVar296 * 0.0 - fVar209 * 0.0;
    auVar325._0_4_ = fVar312 * fStack_384 - fVar101 * fStack_394;
    auVar325._4_4_ = fVar316 * fStack_380 - fVar197 * fStack_390;
    auVar325._8_4_ = fVar293 * fStack_37c - fVar198 * fStack_38c;
    auVar325._12_4_ = fVar296 * 0.0 - fVar209 * 0.0;
    auVar94._0_8_ =
         CONCAT44(fVar172 * fVar316 - fVar292 * fVar197,fVar171 * fVar312 - fVar211 * fVar101);
    auVar94._8_4_ = fVar173 * fVar293 - fVar306 * fVar198;
    auVar94._12_4_ = fVar262 * fVar296 - fVar250 * fVar209;
    auVar272._0_4_ = local_218 * fVar312 - fVar144 * fVar101;
    auVar272._4_4_ = fStack_214 * fVar316 - fVar279 * fVar197;
    auVar272._8_4_ = fStack_210 * fVar293 - fVar308 * fVar198;
    auVar272._12_4_ = fStack_20c * fVar296 - fVar290 * fVar209;
    auVar223._0_8_ =
         CONCAT44(local_238._4_4_ * fVar316 - fVar197 * local_248._4_4_,
                  local_238._0_4_ * fVar312 - fVar101 * local_248._0_4_);
    auVar223._8_4_ = local_238._8_4_ * fVar293 - fVar198 * local_248._8_4_;
    auVar223._12_4_ = fVar296 * 0.0 - fVar209 * 0.0;
    auVar257._0_4_ = fVar312 * fVar172 - fVar101 * fVar292;
    auVar257._4_4_ = fVar316 * fVar173 - fVar197 * fVar306;
    auVar257._8_4_ = fVar293 * fVar262 - fVar198 * fVar250;
    auVar257._12_4_ = fVar296 * 0.0 - fVar209 * 0.0;
    auVar320._8_4_ = auVar191._8_4_;
    auVar320._0_8_ = auVar191._0_8_;
    auVar320._12_4_ = auVar191._12_4_;
    auVar239 = minps(auVar320,auVar134);
    auVar127 = maxps(auVar191,auVar134);
    auVar135._8_4_ = auVar151._8_4_;
    auVar135._0_8_ = auVar151._0_8_;
    auVar135._12_4_ = auVar151._12_4_;
    auVar73 = minps(auVar135,auVar325);
    auVar321 = minps(auVar239,auVar73);
    auVar73 = maxps(auVar151,auVar325);
    auVar129 = maxps(auVar127,auVar73);
    auVar136._8_4_ = auVar94._8_4_;
    auVar136._0_8_ = auVar94._0_8_;
    auVar136._12_4_ = auVar94._12_4_;
    auVar127 = minps(auVar136,auVar272);
    auVar73 = maxps(auVar94,auVar272);
    auVar152._8_4_ = auVar223._8_4_;
    auVar152._0_8_ = auVar223._0_8_;
    auVar152._12_4_ = auVar223._12_4_;
    auVar239 = minps(auVar152,auVar257);
    auVar127 = minps(auVar127,auVar239);
    auVar239 = minps(auVar321,auVar127);
    auVar127 = maxps(auVar223,auVar257);
    auVar73 = maxps(auVar73,auVar127);
    auVar73 = maxps(auVar129,auVar73);
    auVar192._0_4_ =
         -(uint)(local_268 <= auVar73._0_4_ && auVar239._0_4_ <= local_258) & local_278._0_4_;
    auVar192._4_4_ =
         -(uint)(fStack_264 <= auVar73._4_4_ && auVar239._4_4_ <= fStack_254) & local_278._4_4_;
    auVar192._8_4_ =
         -(uint)(fStack_260 <= auVar73._8_4_ && auVar239._8_4_ <= fStack_250) & local_278._8_4_;
    auVar192._12_4_ =
         -(uint)(fStack_25c <= auVar73._12_4_ && auVar239._12_4_ <= fStack_24c) & local_278._12_4_;
    iVar60 = movmskps((int)pRVar61,auVar192);
    uVar56 = 0;
    if (iVar60 != 0) {
      fVar312 = (fVar292 - fVar211) + (fStack_394 - local_398);
      fVar316 = (fVar306 - fVar292) + (fStack_390 - fStack_394);
      fVar293 = (fVar250 - fVar306) + (fStack_38c - fStack_390);
      fVar296 = (0.0 - fVar250) + (0.0 - fStack_38c);
      fVar101 = (fVar172 - fVar171) + (fStack_384 - local_388);
      fVar197 = (fVar173 - fVar172) + (fStack_380 - fStack_384);
      fVar198 = (fVar262 - fVar173) + (fStack_37c - fStack_380);
      fVar209 = (0.0 - fVar262) + (0.0 - fStack_37c);
      auVar326._0_8_ =
           CONCAT44(fStack_384 * fVar316 - fStack_394 * fVar197,
                    local_388 * fVar312 - local_398 * fVar101);
      auVar326._8_4_ = fStack_380 * fVar293 - fStack_390 * fVar198;
      auVar326._12_4_ = fStack_37c * fVar296 - fStack_38c * fVar209;
      auVar137._0_4_ = fVar102 * fVar312 - fVar222 * fVar101;
      auVar137._4_4_ = fVar123 * fVar316 - fVar261 * fVar197;
      auVar137._8_4_ = fStack_540 * fVar293 - fVar295 * fVar198;
      auVar137._12_4_ = fStack_53c * fVar296 - fVar247 * fVar209;
      auVar217._0_8_ =
           CONCAT44(local_1e8._4_4_ * fVar316 - fVar124 * fVar197,
                    local_1e8._0_4_ * fVar312 - fVar103 * fVar101);
      auVar217._8_4_ = local_1e8._8_4_ * fVar293 - fVar125 * fVar198;
      auVar217._12_4_ = fVar296 * 0.0 - fVar209 * 0.0;
      auVar153._0_4_ = fStack_384 * fVar312 - fStack_394 * fVar101;
      auVar153._4_4_ = fStack_380 * fVar316 - fStack_390 * fVar197;
      auVar153._8_4_ = fStack_37c * fVar293 - fStack_38c * fVar198;
      auVar153._12_4_ = fVar296 * 0.0 - fVar209 * 0.0;
      auVar303._0_8_ =
           CONCAT44(fVar172 * fVar316 - fVar292 * fVar197,fVar171 * fVar312 - fVar211 * fVar101);
      auVar303._8_4_ = fVar173 * fVar293 - fVar306 * fVar198;
      auVar303._12_4_ = fVar262 * fVar296 - fVar250 * fVar209;
      auVar165._0_4_ = local_218 * fVar312 - fVar144 * fVar101;
      auVar165._4_4_ = fStack_214 * fVar316 - fVar279 * fVar197;
      auVar165._8_4_ = fStack_210 * fVar293 - fVar308 * fVar198;
      auVar165._12_4_ = fStack_20c * fVar296 - fVar290 * fVar209;
      auVar273._0_8_ =
           CONCAT44(local_238._4_4_ * fVar316 - local_248._4_4_ * fVar197,
                    local_238._0_4_ * fVar312 - local_248._0_4_ * fVar101);
      auVar273._8_4_ = local_238._8_4_ * fVar293 - local_248._8_4_ * fVar198;
      auVar273._12_4_ = fVar296 * 0.0 - fVar209 * 0.0;
      auVar258._0_4_ = fVar312 * fVar172 - fVar101 * fVar292;
      auVar258._4_4_ = fVar316 * fVar173 - fVar197 * fVar306;
      auVar258._8_4_ = fVar293 * fVar262 - fVar198 * fVar250;
      auVar258._12_4_ = fVar296 * 0.0 - fVar209 * 0.0;
      auVar95._8_4_ = auVar326._8_4_;
      auVar95._0_8_ = auVar326._0_8_;
      auVar95._12_4_ = auVar326._12_4_;
      auVar73 = minps(auVar95,auVar137);
      auVar239 = maxps(auVar326,auVar137);
      auVar138._8_4_ = auVar217._8_4_;
      auVar138._0_8_ = auVar217._0_8_;
      auVar138._12_4_ = auVar217._12_4_;
      auVar127 = minps(auVar138,auVar153);
      auVar73 = minps(auVar73,auVar127);
      auVar127 = maxps(auVar217,auVar153);
      auVar321 = maxps(auVar239,auVar127);
      auVar139._8_4_ = auVar303._8_4_;
      auVar139._0_8_ = auVar303._0_8_;
      auVar139._12_4_ = auVar303._12_4_;
      auVar127 = minps(auVar139,auVar165);
      auVar129 = maxps(auVar303,auVar165);
      auVar154._8_4_ = auVar273._8_4_;
      auVar154._0_8_ = auVar273._0_8_;
      auVar154._12_4_ = auVar273._12_4_;
      auVar239 = minps(auVar154,auVar258);
      auVar127 = minps(auVar127,auVar239);
      auVar73 = minps(auVar73,auVar127);
      auVar127 = maxps(auVar273,auVar258);
      auVar127 = maxps(auVar129,auVar127);
      auVar127 = maxps(auVar321,auVar127);
      auVar327._0_4_ =
           -(uint)(local_268 <= auVar127._0_4_ && auVar73._0_4_ <= local_258) & auVar192._0_4_;
      auVar327._4_4_ =
           -(uint)(fStack_264 <= auVar127._4_4_ && auVar73._4_4_ <= fStack_254) & auVar192._4_4_;
      auVar327._8_4_ =
           -(uint)(fStack_260 <= auVar127._8_4_ && auVar73._8_4_ <= fStack_250) & auVar192._8_4_;
      auVar327._12_4_ =
           -(uint)(fStack_25c <= auVar127._12_4_ && auVar73._12_4_ <= fStack_24c) & auVar192._12_4_;
      uVar69 = movmskps(0,auVar327);
      uVar56 = (ulong)uVar69;
    }
    if ((uint)uVar56 != 0) {
      auStack_308[uVar55] = (uint)uVar56;
      *(undefined8 *)(afStack_108 + uVar55 * 2) = local_528;
      auStack_58[uVar55] = local_538;
      uVar55 = (ulong)((int)uVar55 + 1);
    }
    do {
      if ((int)uVar55 == 0) {
        fVar143 = *(float *)(ray + k * 4 + 0x80);
        auVar122._4_4_ = -(uint)(fStack_2d4 <= fVar143);
        auVar122._0_4_ = -(uint)(local_2d8 <= fVar143);
        auVar122._8_4_ = -(uint)(fStack_2d0 <= fVar143);
        auVar122._12_4_ = -(uint)(fStack_2cc <= fVar143);
        uVar67 = movmskps((int)uVar56,auVar122);
        uVar66 = uVar66 & (uint)local_3d0 & uVar67;
        if (uVar66 == 0) {
          return;
        }
        goto LAB_00c37224;
      }
      uVar70 = (int)uVar55 - 1;
      uVar57 = (ulong)uVar70;
      uVar69 = auStack_308[uVar57];
      local_538 = auStack_58[uVar57];
      uVar56 = 0;
      if (uVar69 != 0) {
        for (; (uVar69 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
        }
      }
      uVar69 = uVar69 - 1 & uVar69;
      auStack_308[uVar57] = uVar69;
      if (uVar69 == 0) {
        uVar55 = (ulong)uVar70;
      }
      pRVar62 = (RTCIntersectArguments *)(uVar56 + 1);
      pRVar61 = pRVar62;
      if ((long)pRVar62 < 0) {
        pRVar61 = (RTCIntersectArguments *)((ulong)((uint)pRVar62 & 1) | (ulong)pRVar62 >> 1);
      }
      fVar101 = afStack_108[uVar57 * 2];
      fVar102 = afStack_108[uVar57 * 2 + 1];
      fVar103 = fVar101 * (1.0 - (float)uVar56 * 0.33333334) + fVar102 * (float)uVar56 * 0.33333334;
      fVar123 = fVar101 * (1.0 - (float)pRVar62 * 0.33333334) +
                fVar102 * (float)pRVar62 * 0.33333334;
      fVar124 = fVar101 * 0.0 + fVar102 * 0.0;
      fVar102 = fVar101 * 0.0 + fVar102 * 0.0;
      fVar101 = fVar123 - fVar103;
      local_528 = CONCAT44(fVar123,fVar103);
      if (0.16666667 <= fVar101) break;
      fVar125 = (float)local_538;
      fVar144 = (float)((ulong)local_538 >> 0x20);
      fVar197 = 1.0 - fVar125;
      fVar198 = 1.0 - fVar125;
      fVar209 = 1.0 - fVar144;
      fVar211 = 1.0 - fVar144;
      fVar292 = fVar199 * fVar197 + (float)local_348 * fVar125;
      fVar306 = fVar210 * fVar198 + local_348._4_4_ * fVar125;
      fVar250 = fVar199 * fVar209 + (float)uStack_340 * fVar144;
      fVar279 = fVar210 * fVar211 + uStack_340._4_4_ * fVar144;
      fVar293 = (float)local_318 * fVar197 + (float)local_358 * fVar125;
      fVar296 = local_318._4_4_ * fVar198 + local_358._4_4_ * fVar125;
      fVar164 = (float)uStack_310 * fVar209 + (float)uStack_350 * fVar144;
      fVar318 = uStack_310._4_4_ * fVar211 + uStack_350._4_4_ * fVar144;
      fVar168 = (float)local_328 * fVar197 + (float)local_368 * fVar125;
      fVar170 = local_328._4_4_ * fVar198 + local_368._4_4_ * fVar125;
      fVar172 = (float)uStack_320 * fVar209 + (float)uStack_360 * fVar144;
      fVar262 = uStack_320._4_4_ * fVar211 + uStack_360._4_4_ * fVar144;
      fVar308 = (fVar197 * (float)local_338 + fVar125 * (float)local_378) - fVar168;
      fVar290 = (fVar198 * local_338._4_4_ + fVar125 * local_378._4_4_) - fVar170;
      fVar312 = (fVar209 * (float)uStack_330 + fVar144 * (float)uStack_370) - fVar172;
      fVar316 = (fVar211 * uStack_330._4_4_ + fVar144 * uStack_370._4_4_) - fVar262;
      fVar125 = fVar103 * (fVar168 - fVar293) + fVar293;
      fVar144 = fVar103 * (fVar170 - fVar296) + fVar296;
      fVar197 = fVar103 * (fVar172 - fVar164) + fVar164;
      fVar198 = fVar103 * (fVar262 - fVar318) + fVar318;
      fVar319 = (fVar168 - fVar293) * fVar123 + fVar293;
      fVar171 = (fVar170 - fVar296) * fVar123 + fVar296;
      fVar173 = (fVar172 - fVar164) * fVar123 + fVar164;
      fVar264 = (fVar262 - fVar318) * fVar123 + fVar318;
      fVar209 = fVar103 * (fVar293 - fVar292) + fVar292;
      fVar211 = fVar103 * (fVar296 - fVar306) + fVar306;
      fVar222 = fVar103 * (fVar164 - fVar250) + fVar250;
      fVar261 = fVar103 * (fVar318 - fVar279) + fVar279;
      fVar209 = (fVar125 - fVar209) * fVar103 + fVar209;
      fVar211 = (fVar144 - fVar211) * fVar103 + fVar211;
      fVar222 = (fVar197 - fVar222) * fVar103 + fVar222;
      fVar261 = (fVar198 - fVar261) * fVar103 + fVar261;
      fVar125 = (((fVar103 * fVar308 + fVar168) - fVar125) * fVar103 + fVar125) - fVar209;
      fVar144 = (((fVar103 * fVar290 + fVar170) - fVar144) * fVar103 + fVar144) - fVar211;
      fVar197 = (((fVar103 * fVar312 + fVar172) - fVar197) * fVar103 + fVar197) - fVar222;
      fVar198 = (((fVar103 * fVar316 + fVar262) - fVar198) * fVar103 + fVar198) - fVar261;
      fVar209 = fVar103 * fVar125 + fVar209;
      fVar211 = fVar103 * fVar144 + fVar211;
      fVar222 = fVar103 * fVar197 + fVar222;
      fVar261 = fVar103 * fVar198 + fVar261;
      fVar292 = (fVar293 - fVar292) * fVar123 + fVar292;
      fVar306 = (fVar296 - fVar306) * fVar123 + fVar306;
      fVar250 = (fVar164 - fVar250) * fVar123 + fVar250;
      fVar279 = (fVar318 - fVar279) * fVar123 + fVar279;
      fVar292 = (fVar319 - fVar292) * fVar123 + fVar292;
      fVar306 = (fVar171 - fVar306) * fVar123 + fVar306;
      fVar250 = (fVar173 - fVar250) * fVar123 + fVar250;
      fVar279 = (fVar264 - fVar279) * fVar123 + fVar279;
      fVar293 = (((fVar308 * fVar123 + fVar168) - fVar319) * fVar123 + fVar319) - fVar292;
      fVar296 = (((fVar290 * fVar123 + fVar170) - fVar171) * fVar123 + fVar171) - fVar306;
      fVar164 = (((fVar312 * fVar123 + fVar172) - fVar173) * fVar123 + fVar173) - fVar250;
      fVar318 = (((fVar316 * fVar123 + fVar262) - fVar264) * fVar123 + fVar264) - fVar279;
      fVar292 = fVar123 * fVar293 + fVar292;
      fVar306 = fVar123 * fVar296 + fVar306;
      fVar250 = fVar123 * fVar164 + fVar250;
      fVar279 = fVar123 * fVar318 + fVar279;
      fVar168 = fVar101 * 0.33333334;
      fVar308 = fVar125 * 3.0 * fVar168 + fVar209;
      fVar290 = fVar144 * 3.0 * fVar168 + fVar211;
      fVar312 = fVar197 * 3.0 * fVar168 + fVar222;
      fVar316 = fVar198 * 3.0 * fVar168 + fVar261;
      fVar293 = fVar292 - fVar168 * fVar293 * 3.0;
      fVar296 = fVar306 - fVar168 * fVar296 * 3.0;
      fVar164 = fVar250 - fVar168 * fVar164 * 3.0;
      fVar318 = fVar279 - fVar168 * fVar318 * 3.0;
      local_538 = CONCAT44(fVar261,fVar222);
      fVar171 = (fVar250 - fVar292) + (fVar222 - fVar209);
      fVar172 = (fVar279 - fVar306) + (fVar261 - fVar211);
      auVar224._0_4_ = fVar172 * fVar306;
      auVar224._4_4_ = fVar172 * fVar306;
      auVar224._8_4_ = fVar172 * fVar279;
      auVar224._12_4_ = fVar172 * fVar279;
      fVar125 = fVar209 * fVar171 + fVar211 * fVar172;
      fVar144 = fVar222 * fVar171 + fVar261 * fVar172;
      fVar173 = fVar308 * fVar171 + fVar290 * fVar172;
      fVar262 = fVar312 * fVar171 + fVar316 * fVar172;
      fVar168 = fVar293 * fVar171 + fVar296 * fVar172;
      auVar240._4_4_ = fVar296 * fVar171 + fVar296 * fVar172;
      auVar240._0_4_ = fVar168;
      fVar319 = fVar164 * fVar171 + fVar318 * fVar172;
      fVar197 = fVar171 * fVar292 + auVar224._0_4_;
      fVar170 = fVar171 * fVar250 + auVar224._8_4_;
      auVar22._4_8_ = auVar224._8_8_;
      auVar22._0_4_ = fVar290 * fVar171 + fVar290 * fVar172;
      auVar225._0_8_ = auVar22._0_8_ << 0x20;
      auVar225._8_4_ = fVar262;
      auVar225._12_4_ = fVar316 * fVar171 + fVar316 * fVar172;
      fVar198 = fVar173;
      if (fVar173 <= fVar125) {
        fVar198 = fVar125;
        fVar125 = fVar173;
      }
      auVar226._8_8_ = auVar225._8_8_;
      auVar226._0_8_ = auVar226._8_8_;
      auVar240._8_4_ = fVar319;
      auVar240._12_4_ = fVar318 * fVar171 + fVar318 * fVar172;
      if (fVar197 <= fVar168) {
        auVar240._0_4_ = fVar197;
      }
      if (auVar240._0_4_ <= fVar125) {
        fVar125 = auVar240._0_4_;
      }
      auVar23._4_8_ = auVar240._8_8_;
      auVar23._0_4_ = fVar171 * fVar306 + auVar224._4_4_;
      auVar241._0_8_ = auVar23._0_8_ << 0x20;
      auVar241._8_4_ = fVar170;
      auVar241._12_4_ = fVar171 * fVar279 + auVar224._12_4_;
      if (fVar197 <= fVar168) {
        fVar197 = fVar168;
      }
      auVar242._8_8_ = auVar241._8_8_;
      auVar242._0_8_ = auVar242._8_8_;
      if (fVar197 <= fVar198) {
        fVar197 = fVar198;
      }
      if (fVar262 <= fVar144) {
        auVar226._0_4_ = fVar144;
        fVar144 = fVar262;
      }
      fVar198 = fVar319;
      if (fVar170 <= fVar319) {
        fVar198 = fVar170;
      }
      if (fVar198 <= fVar144) {
        fVar144 = fVar198;
      }
      if (fVar170 <= fVar319) {
        auVar242._0_4_ = fVar319;
      }
      if (auVar242._0_4_ <= auVar226._0_4_) {
        auVar242._0_4_ = auVar226._0_4_;
      }
      bVar65 = 3 < (uint)uVar55;
      uVar24 = (undefined3)(uVar70 >> 8);
      uVar56 = (ulong)CONCAT31(uVar24,bVar65);
      fVar198 = auVar242._0_4_;
      if ((0.0001 <= fVar125) || (fVar198 <= -0.0001)) {
        if ((-0.0001 < fVar197 && fVar144 < 0.0001) ||
           ((fVar125 < 0.0001 && -0.0001 < fVar197 || (fVar144 < 0.0001 && -0.0001 < fVar198))))
        goto LAB_00c38a6a;
        bVar27 = true;
        pRVar61 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar61 >> 8),fVar101 < 0.001);
      }
      else {
LAB_00c38a6a:
        bVar65 = bVar65 || fVar101 < 0.001;
        uVar56 = (ulong)CONCAT31(uVar24,bVar65);
        fVar170 = (float)(~-(uint)(fVar125 < 0.0) & 0x3f800000 | -(uint)(fVar125 < 0.0) & 0xbf800000
                         );
        fVar319 = (float)(~-(uint)(fVar197 < 0.0) & 0x3f800000 | -(uint)(fVar197 < 0.0) & 0xbf800000
                         );
        fVar168 = 0.0;
        if ((fVar170 == fVar319) && (!NAN(fVar170) && !NAN(fVar319))) {
          fVar168 = INFINITY;
        }
        fVar171 = 0.0;
        if ((fVar170 == fVar319) && (!NAN(fVar170) && !NAN(fVar319))) {
          fVar171 = -INFINITY;
        }
        fVar172 = (float)(~-(uint)(fVar144 < 0.0) & 0x3f800000 | -(uint)(fVar144 < 0.0) & 0xbf800000
                         );
        if ((fVar170 != fVar172) || (fVar173 = fVar171, NAN(fVar170) || NAN(fVar172))) {
          if ((fVar144 != fVar125) || (NAN(fVar144) || NAN(fVar125))) {
            fVar144 = -fVar125 / (fVar144 - fVar125);
            fVar144 = (1.0 - fVar144) * 0.0 + fVar144;
            fVar173 = fVar144;
          }
          else {
            fVar144 = INFINITY;
            if ((fVar125 == 0.0) && (fVar144 = INFINITY, !NAN(fVar125))) {
              fVar144 = 0.0;
            }
            fVar173 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar125 == 0.0) & 1) * 4);
          }
          if (fVar144 <= fVar168) {
            fVar168 = fVar144;
          }
          if (fVar173 <= fVar171) {
            fVar173 = fVar171;
          }
        }
        pRVar61 = (RTCIntersectArguments *)(ulong)(fVar198 < 0.0);
        fVar125 = *(float *)(&DAT_01ff1ecc + (long)pRVar61 * 4);
        if ((fVar319 != fVar125) || (fVar144 = fVar173, NAN(fVar319) || NAN(fVar125))) {
          if ((fVar198 != fVar197) || (NAN(fVar198) || NAN(fVar197))) {
            fVar198 = -fVar197 / (fVar198 - fVar197);
            fVar198 = (1.0 - fVar198) * 0.0 + fVar198;
            fVar144 = fVar198;
          }
          else {
            fVar198 = INFINITY;
            if ((fVar197 == 0.0) && (fVar198 = INFINITY, !NAN(fVar197))) {
              fVar198 = 0.0;
            }
            pRVar61 = (RTCIntersectArguments *)(ulong)(-(uint)(fVar197 == 0.0) & 1);
            fVar144 = *(float *)(&DAT_01ff1ec4 + (long)pRVar61 * 4);
          }
          if (fVar198 <= fVar168) {
            fVar168 = fVar198;
          }
          if (fVar144 <= fVar173) {
            fVar144 = fVar173;
          }
        }
        if ((fVar172 != fVar125) || (NAN(fVar172) || NAN(fVar125))) {
          fVar168 = (float)(~-(uint)(fVar168 < 1.0) & 0x3f800000 |
                           (uint)fVar168 & -(uint)(fVar168 < 1.0));
          fVar144 = (float)(~-(uint)(fVar144 < 1.0) & (uint)fVar144 |
                           -(uint)(fVar144 < 1.0) & 0x3f800000);
        }
        fVar168 = (float)(~-(uint)(fVar168 < 0.0) & (uint)fVar168);
        fVar125 = (float)(~-(uint)(fVar144 < 1.0) & 0x3f800000 |
                         (uint)fVar144 & -(uint)(fVar144 < 1.0));
        bVar27 = true;
        if (fVar168 <= fVar125) {
          fVar168 = fVar168 + -0.1;
          fVar125 = fVar125 + 0.1;
          uVar69 = -(uint)(fVar125 < 1.0);
          fVar168 = (float)(~-(uint)(fVar168 < 0.0) & (uint)fVar168);
          fVar173 = (float)(~uVar69 & 0x3f800000 | (uint)fVar125 & uVar69);
          fVar319 = 1.0 - fVar168;
          fVar170 = 1.0 - fVar168;
          fVar171 = 1.0 - fVar173;
          fVar172 = 1.0 - fVar173;
          fVar125 = fVar209 * fVar319 + fVar222 * fVar168;
          fVar144 = fVar211 * fVar170 + fVar261 * fVar168;
          fVar197 = fVar209 * fVar171 + fStack_540 * fVar173;
          fVar198 = fVar211 * fVar172 + fStack_53c * fVar173;
          fVar209 = fVar308 * fVar319 + fVar312 * fVar168;
          fVar211 = fVar290 * fVar170 + fVar316 * fVar168;
          fVar308 = fVar308 * fVar171 + fVar312 * fVar173;
          fVar290 = fVar290 * fVar172 + fVar316 * fVar173;
          fVar312 = fVar293 * fVar319 + fVar164 * fVar168;
          fVar316 = fVar296 * fVar170 + fVar318 * fVar168;
          fVar293 = fVar293 * fVar171 + fVar164 * fVar173;
          fVar296 = fVar296 * fVar172 + fVar318 * fVar173;
          fVar164 = fVar319 * fVar292 + fVar250 * fVar168;
          fVar318 = fVar170 * fVar306 + fVar279 * fVar168;
          fVar292 = fVar171 * fVar292 + fVar295 * fVar173;
          fVar306 = fVar172 * fVar306 + fVar247 * fVar173;
          fVar307 = fVar222 * (1.0 - fVar168) + fVar261 * fVar168;
          fStack_53c = fVar222 * (1.0 - fVar173) + fVar261 * fVar173;
          fVar101 = 1.0 / fVar101;
          auVar119._0_4_ = fVar292 - fVar164;
          auVar119._4_4_ = fVar306 - fVar318;
          auVar119._8_4_ = fVar292 - fVar292;
          auVar119._12_4_ = fVar306 - fVar306;
          auVar155._0_8_ = CONCAT44(fVar296 - fVar316,fVar293 - fVar312);
          auVar155._8_4_ = fVar293 - fVar293;
          auVar155._12_4_ = fVar296 - fVar296;
          auVar259._0_4_ = fVar308 - fVar209;
          auVar259._4_4_ = fVar290 - fVar211;
          auVar259._8_4_ = fVar308 - fVar308;
          auVar259._12_4_ = fVar290 - fVar290;
          auVar218._0_8_ = CONCAT44((fVar211 - fVar144) * 3.0,(fVar209 - fVar125) * 3.0);
          auVar218._8_4_ = (fVar308 - fVar197) * 3.0;
          auVar218._12_4_ = (fVar290 - fVar198) * 3.0;
          auVar193._0_8_ = CONCAT44((fVar316 - fVar211) * 3.0,(fVar312 - fVar209) * 3.0);
          auVar193._8_4_ = (fVar293 - fVar308) * 3.0;
          auVar193._12_4_ = (fVar296 - fVar290) * 3.0;
          auVar243._0_4_ = (fVar164 - fVar312) * 3.0;
          auVar243._4_4_ = (fVar318 - fVar316) * 3.0;
          auVar243._8_4_ = (fVar292 - fVar293) * 3.0;
          auVar243._12_4_ = (fVar306 - fVar296) * 3.0;
          auVar201._8_4_ = auVar193._8_4_;
          auVar201._0_8_ = auVar193._0_8_;
          auVar201._12_4_ = auVar193._12_4_;
          auVar127 = minps(auVar201,auVar243);
          auVar73 = maxps(auVar193,auVar243);
          auVar227._8_4_ = auVar218._8_4_;
          auVar227._0_8_ = auVar218._0_8_;
          auVar227._12_4_ = auVar218._12_4_;
          auVar129 = minps(auVar227,auVar127);
          auVar239 = maxps(auVar218,auVar73);
          auVar25._4_8_ = auVar73._8_8_;
          auVar25._0_4_ = auVar129._4_4_;
          auVar194._0_8_ = auVar25._0_8_ << 0x20;
          auVar194._8_4_ = auVar129._8_4_;
          auVar194._12_4_ = auVar129._12_4_;
          auVar195._8_8_ = auVar129._8_8_;
          auVar195._0_8_ = auVar194._8_8_;
          auVar26._4_8_ = auVar127._8_8_;
          auVar26._0_4_ = auVar239._4_4_;
          auVar202._0_8_ = auVar26._0_8_ << 0x20;
          auVar202._8_4_ = auVar239._8_4_;
          auVar202._12_4_ = auVar239._12_4_;
          auVar203._8_8_ = auVar239._8_8_;
          auVar203._0_8_ = auVar202._8_8_;
          auVar127 = minps(auVar129,auVar195);
          auVar73 = maxps(auVar239,auVar203);
          fVar173 = auVar127._0_4_ * fVar101;
          fVar262 = auVar127._4_4_ * fVar101;
          fVar264 = auVar127._8_4_ * fVar101;
          fVar265 = auVar127._12_4_ * fVar101;
          fVar312 = fVar101 * auVar73._0_4_;
          fVar293 = fVar101 * auVar73._4_4_;
          fVar164 = fVar101 * auVar73._8_4_;
          fVar101 = fVar101 * auVar73._12_4_;
          fVar171 = 1.0 / (fStack_53c - fVar307);
          auVar140._0_8_ = CONCAT44(fVar198 - fVar144,fVar197 - fVar125);
          auVar140._8_4_ = fVar197 - fVar197;
          auVar140._12_4_ = fVar198 - fVar198;
          auVar204._8_4_ = auVar140._8_4_;
          auVar204._0_8_ = auVar140._0_8_;
          auVar204._12_4_ = auVar140._12_4_;
          auVar239 = minps(auVar204,auVar259);
          auVar127 = maxps(auVar140,auVar259);
          auVar96._8_4_ = auVar155._8_4_;
          auVar96._0_8_ = auVar155._0_8_;
          auVar96._12_4_ = auVar155._12_4_;
          auVar73 = minps(auVar96,auVar119);
          auVar239 = minps(auVar239,auVar73);
          auVar73 = maxps(auVar155,auVar119);
          auVar73 = maxps(auVar127,auVar73);
          fVar319 = auVar239._0_4_ * fVar171;
          fVar170 = auVar239._4_4_ * fVar171;
          fVar172 = fVar171 * auVar73._0_4_;
          fVar171 = fVar171 * auVar73._4_4_;
          local_538 = CONCAT44(fStack_53c,fVar307);
          auVar196._4_4_ = fStack_53c;
          auVar196._0_4_ = fVar123;
          auVar196._8_4_ = fVar124;
          auVar196._12_4_ = fVar102;
          fVar125 = (fVar103 + fVar123) * 0.5;
          fVar144 = (fVar307 + fStack_53c) * 0.5;
          fVar197 = (fVar123 + fVar124) * 0.0;
          fVar198 = (fStack_53c + fVar102) * 0.0;
          fVar209 = local_118 * fVar125 + fVar199;
          fVar222 = fStack_114 * fVar125 + fVar210;
          fVar211 = fStack_110 * fVar125 + fVar263;
          fVar261 = fStack_10c * fVar125 + fVar266;
          fVar292 = local_128 * fVar125 + fVar220;
          fVar306 = fStack_124 * fVar125 + fVar221;
          fVar308 = fStack_120 * fVar125 + fVar275;
          fVar290 = fStack_11c * fVar125 + fVar276;
          fVar209 = (fVar292 - fVar209) * fVar125 + fVar209;
          fVar222 = (fVar306 - fVar222) * fVar125 + fVar222;
          fVar211 = (fVar308 - fVar211) * fVar125 + fVar211;
          fVar261 = (fVar290 - fVar261) * fVar125 + fVar261;
          fVar292 = (((local_138 * fVar125 + fVar234) - fVar292) * fVar125 + fVar292) - fVar209;
          fVar306 = (((fStack_134 * fVar125 + fVar298) - fVar306) * fVar125 + fVar306) - fVar222;
          fVar308 = (((fStack_130 * fVar125 + fVar277) - fVar308) * fVar125 + fVar308) - fVar211;
          fVar290 = (((fStack_12c * fVar125 + fVar289) - fVar290) * fVar125 + fVar290) - fVar261;
          fVar209 = fVar125 * fVar292 + fVar209;
          fVar222 = fVar125 * fVar306 + fVar222;
          fVar292 = fVar292 * 3.0;
          fVar306 = fVar306 * 3.0;
          fVar211 = (fVar125 * fVar308 + fVar211) - fVar209;
          fVar261 = (fVar125 * fVar290 + fVar261) - fVar222;
          fVar292 = (fVar308 * 3.0 - fVar292) * fVar144 + fVar292;
          fVar306 = (fVar290 * 3.0 - fVar306) * fVar144 + fVar306;
          auVar120._0_8_ = CONCAT44(fVar292,fVar211) ^ 0x80000000;
          auVar120._8_4_ = fVar292;
          auVar120._12_4_ = fVar292;
          fVar280 = fVar103 - fVar125;
          fVar291 = fVar307 - fVar144;
          fVar294 = fVar123 - fVar197;
          fVar297 = fStack_53c - fVar198;
          fVar300 = fVar123 - fVar125;
          fVar302 = fStack_53c - fVar144;
          fVar124 = fVar124 - fVar197;
          fVar102 = fVar102 - fVar198;
          fVar209 = fVar211 * fVar144 + fVar209;
          fVar222 = fVar261 * fVar144 + fVar222;
          auVar141._0_8_ = CONCAT44(fVar306,fVar261) ^ 0x8000000000000000;
          auVar141._8_4_ = -fVar306;
          auVar141._12_4_ = -fVar306;
          auVar286._0_4_ = fVar261 * fVar292 - fVar306 * fVar211;
          auVar286._4_4_ = auVar286._0_4_;
          auVar286._8_4_ = auVar286._0_4_;
          auVar286._12_4_ = auVar286._0_4_;
          auVar127 = divps(auVar141,auVar286);
          auVar73 = divps(auVar120,auVar286);
          fVar292 = auVar127._0_4_;
          fVar306 = auVar127._4_4_;
          fVar211 = auVar73._0_4_;
          fVar261 = auVar73._4_4_;
          fVar125 = fVar125 - (fVar222 * fVar211 + fVar209 * fVar292);
          fVar197 = fVar144 - (fVar222 * fVar261 + fVar209 * fVar306);
          fVar198 = fVar144 - (fVar222 * auVar73._8_4_ + fVar209 * auVar127._8_4_);
          fVar144 = fVar144 - (fVar222 * auVar73._12_4_ + fVar209 * auVar127._12_4_);
          auVar322._0_8_ = CONCAT44(fVar306 * fVar319,fVar306 * fVar173);
          auVar322._8_4_ = fVar306 * fVar262;
          auVar322._12_4_ = fVar306 * fVar170;
          auVar244._0_4_ = fVar306 * fVar312;
          auVar244._4_4_ = fVar306 * fVar172;
          auVar244._8_4_ = fVar306 * fVar293;
          auVar244._12_4_ = fVar306 * fVar171;
          auVar328._8_4_ = auVar322._8_4_;
          auVar328._0_8_ = auVar322._0_8_;
          auVar328._12_4_ = auVar322._12_4_;
          auVar129 = minps(auVar328,auVar244);
          auVar127 = maxps(auVar244,auVar322);
          auVar156._0_8_ = CONCAT44(fVar261 * fVar170,fVar261 * fVar262);
          auVar156._8_4_ = fVar261 * fVar264;
          auVar156._12_4_ = fVar261 * fVar265;
          auVar323._0_4_ = fVar261 * fVar293;
          auVar323._4_4_ = fVar261 * fVar171;
          auVar323._8_4_ = fVar261 * fVar164;
          auVar323._12_4_ = fVar261 * fVar101;
          auVar228._8_4_ = auVar156._8_4_;
          auVar228._0_8_ = auVar156._0_8_;
          auVar228._12_4_ = auVar156._12_4_;
          auVar73 = minps(auVar228,auVar323);
          auVar239 = maxps(auVar323,auVar156);
          fVar209 = 0.0 - (auVar239._0_4_ + auVar127._0_4_);
          fVar222 = 1.0 - (auVar239._4_4_ + auVar127._4_4_);
          fVar308 = 0.0 - (auVar239._8_4_ + auVar127._8_4_);
          fVar290 = 0.0 - (auVar239._12_4_ + auVar127._12_4_);
          fVar316 = 0.0 - (auVar73._0_4_ + auVar129._0_4_);
          fVar296 = 1.0 - (auVar73._4_4_ + auVar129._4_4_);
          fVar318 = 0.0 - (auVar73._8_4_ + auVar129._8_4_);
          fVar168 = 0.0 - (auVar73._12_4_ + auVar129._12_4_);
          auVar245._0_8_ = CONCAT44(fVar291 * fVar222,fVar280 * fVar209);
          auVar245._8_4_ = fVar294 * fVar308;
          auVar245._12_4_ = fVar297 * fVar290;
          auVar287._0_8_ = CONCAT44(fVar319 * fVar292,fVar173 * fVar292);
          auVar287._8_4_ = fVar262 * fVar292;
          auVar287._12_4_ = fVar170 * fVar292;
          auVar229._0_4_ = fVar292 * fVar312;
          auVar229._4_4_ = fVar292 * fVar172;
          auVar229._8_4_ = fVar292 * fVar293;
          auVar229._12_4_ = fVar292 * fVar171;
          auVar304._8_4_ = auVar287._8_4_;
          auVar304._0_8_ = auVar287._0_8_;
          auVar304._12_4_ = auVar287._12_4_;
          auVar127 = minps(auVar304,auVar229);
          auVar73 = maxps(auVar229,auVar287);
          auVar205._0_8_ = CONCAT44(fVar170 * fVar211,fVar262 * fVar211);
          auVar205._8_4_ = fVar264 * fVar211;
          auVar205._12_4_ = fVar265 * fVar211;
          auVar324._0_4_ = fVar211 * fVar293;
          auVar324._4_4_ = fVar211 * fVar171;
          auVar324._8_4_ = fVar211 * fVar164;
          auVar324._12_4_ = fVar211 * fVar101;
          auVar329._8_4_ = auVar205._8_4_;
          auVar329._0_8_ = auVar205._0_8_;
          auVar329._12_4_ = auVar205._12_4_;
          auVar129 = minps(auVar329,auVar324);
          auVar288._0_4_ = fVar280 * fVar316;
          auVar288._4_4_ = fVar291 * fVar296;
          auVar288._8_4_ = fVar294 * fVar318;
          auVar288._12_4_ = fVar297 * fVar168;
          auVar157._0_8_ = CONCAT44(fVar222 * fVar302,fVar209 * fVar300);
          auVar157._8_4_ = fVar308 * fVar124;
          auVar157._12_4_ = fVar290 * fVar102;
          auVar166._0_4_ = fVar316 * fVar300;
          auVar166._4_4_ = fVar296 * fVar302;
          auVar166._8_4_ = fVar318 * fVar124;
          auVar166._12_4_ = fVar168 * fVar102;
          auVar239 = maxps(auVar324,auVar205);
          fVar101 = 1.0 - (auVar239._0_4_ + auVar73._0_4_);
          fVar209 = 0.0 - (auVar239._4_4_ + auVar73._4_4_);
          fVar222 = 0.0 - (auVar239._8_4_ + auVar73._8_4_);
          fVar308 = 0.0 - (auVar239._12_4_ + auVar73._12_4_);
          fVar290 = 1.0 - (auVar129._0_4_ + auVar127._0_4_);
          fVar312 = 0.0 - (auVar129._4_4_ + auVar127._4_4_);
          fVar316 = 0.0 - (auVar129._8_4_ + auVar127._8_4_);
          fVar293 = 0.0 - (auVar129._12_4_ + auVar127._12_4_);
          auVar230._0_8_ = CONCAT44(fVar291 * fVar209,fVar280 * fVar101);
          auVar230._8_4_ = fVar294 * fVar222;
          auVar230._12_4_ = fVar297 * fVar308;
          auVar260._0_4_ = fVar280 * fVar290;
          auVar260._4_4_ = fVar291 * fVar312;
          auVar260._8_4_ = fVar294 * fVar316;
          auVar260._12_4_ = fVar297 * fVar293;
          auVar206._0_8_ = CONCAT44(fVar209 * fVar302,fVar101 * fVar300);
          auVar206._8_4_ = fVar222 * fVar124;
          auVar206._12_4_ = fVar308 * fVar102;
          auVar219._0_4_ = fVar290 * fVar300;
          auVar219._4_4_ = fVar312 * fVar302;
          auVar219._8_4_ = fVar316 * fVar124;
          auVar219._12_4_ = fVar293 * fVar102;
          auVar274._8_4_ = auVar230._8_4_;
          auVar274._0_8_ = auVar230._0_8_;
          auVar274._12_4_ = auVar230._12_4_;
          auVar73 = minps(auVar274,auVar260);
          auVar305._8_4_ = auVar206._8_4_;
          auVar305._0_8_ = auVar206._0_8_;
          auVar305._12_4_ = auVar206._12_4_;
          auVar127 = minps(auVar305,auVar219);
          auVar129 = minps(auVar73,auVar127);
          auVar127 = maxps(auVar260,auVar230);
          auVar73 = maxps(auVar219,auVar206);
          auVar239 = maxps(auVar73,auVar127);
          auVar207._8_4_ = auVar245._8_4_;
          auVar207._0_8_ = auVar245._0_8_;
          auVar207._12_4_ = auVar245._12_4_;
          auVar73 = minps(auVar207,auVar288);
          auVar231._8_4_ = auVar157._8_4_;
          auVar231._0_8_ = auVar157._0_8_;
          auVar231._12_4_ = auVar157._12_4_;
          auVar127 = minps(auVar231,auVar166);
          auVar127 = minps(auVar73,auVar127);
          auVar321 = maxps(auVar288,auVar245);
          auVar73 = maxps(auVar166,auVar157);
          auVar73 = maxps(auVar73,auVar321);
          auVar208._0_4_ = auVar129._4_4_ + auVar129._0_4_ + fVar125;
          auVar208._4_4_ = auVar127._4_4_ + auVar127._0_4_ + fVar197;
          auVar208._8_4_ = auVar129._8_4_ + auVar129._4_4_ + fVar198;
          auVar208._12_4_ = auVar129._12_4_ + auVar127._4_4_ + fVar144;
          fVar101 = auVar239._4_4_ + auVar239._0_4_ + fVar125;
          fVar102 = auVar73._4_4_ + auVar73._0_4_ + fVar197;
          auVar158._4_4_ = fVar102;
          auVar158._0_4_ = fVar101;
          auVar30._4_4_ = fVar307;
          auVar30._0_4_ = fVar103;
          auVar30._8_4_ = fVar123;
          auVar30._12_4_ = fStack_53c;
          auVar127 = maxps(auVar30,auVar208);
          auVar158._8_4_ = auVar239._8_4_ + auVar239._4_4_ + fVar198;
          auVar158._12_4_ = auVar239._12_4_ + auVar73._4_4_ + fVar144;
          auVar73 = minps(auVar158,auVar196);
          iVar60 = -(uint)(auVar73._0_4_ < auVar127._0_4_);
          iVar68 = -(uint)(auVar73._4_4_ < auVar127._4_4_);
          auVar160._4_4_ = iVar68;
          auVar160._0_4_ = iVar60;
          auVar160._8_4_ = iVar68;
          auVar160._12_4_ = iVar68;
          auVar159._8_8_ = auVar160._8_8_;
          auVar159._4_4_ = iVar60;
          auVar159._0_4_ = iVar60;
          uVar69 = movmskpd((int)pRVar61,auVar159);
          pRVar61 = (RTCIntersectArguments *)(ulong)uVar69;
          fStack_540 = fVar123;
          if (uVar69 == 0) {
            pRVar61 = (RTCIntersectArguments *)0x0;
            if (auVar208._0_4_ <= fVar103) {
              auVar330._4_4_ = fVar210;
              auVar330._0_4_ = fVar199;
              auVar330._8_4_ = fVar263;
              auVar330._12_4_ = fVar266;
            }
            else {
              auVar330._4_4_ = fVar210;
              auVar330._0_4_ = fVar199;
              auVar330._8_4_ = fVar263;
              auVar330._12_4_ = fVar266;
              if (fVar101 < fVar123) {
                iVar60 = -(uint)(fVar102 < fStack_53c);
                pRVar61 = (RTCIntersectArguments *)
                          (ulong)CONCAT11((char)((uint)iVar60 >> 8),
                                          (byte)iVar60 & fVar307 < auVar208._4_4_);
              }
            }
            bVar53 = bVar65 | (byte)pRVar61;
            uVar56 = (ulong)CONCAT31(uVar24,bVar53);
            if (bVar53 == 1) {
              uVar56 = 200;
              do {
                fVar102 = 1.0 - fVar125;
                fVar124 = fVar125 * fVar125 * fVar125;
                fVar123 = fVar125 * fVar125 * 3.0 * fVar102;
                fVar101 = fVar102 * fVar102 * fVar102;
                fVar144 = fVar125 * 3.0 * fVar102 * fVar102;
                fVar102 = fVar101 * auVar330._0_4_ +
                          fVar144 * fVar220 + fVar123 * fVar234 + fVar124 * (float)local_148._0_4_;
                fVar103 = fVar101 * auVar330._4_4_ +
                          fVar144 * fVar221 + fVar123 * fVar298 + fVar124 * (float)local_148._4_4_;
                fVar102 = ((fVar101 * auVar330._8_4_ +
                           fVar144 * fVar275 + fVar123 * fVar277 + fVar124 * fStack_140) - fVar102)
                          * fVar197 + fVar102;
                fVar103 = ((fVar101 * auVar330._12_4_ +
                           fVar144 * fVar276 + fVar123 * fVar289 + fVar124 * fStack_13c) - fVar103)
                          * fVar197 + fVar103;
                fVar125 = fVar125 - (fVar103 * fVar211 + fVar102 * fVar292);
                fVar197 = fVar197 - (fVar103 * fVar261 + fVar102 * fVar306);
                fVar101 = ABS(fVar103);
                if (ABS(fVar103) <= ABS(fVar102)) {
                  fVar101 = ABS(fVar102);
                }
                if (fVar101 < fVar143) {
                  if ((((0.0 <= fVar125) && (fVar125 <= 1.0)) && (0.0 <= fVar197)) &&
                     (fVar197 <= 1.0)) {
                    fVar101 = pre->ray_space[k].vx.field_0.m128[2];
                    fVar102 = pre->ray_space[k].vy.field_0.m128[2];
                    fVar103 = pre->ray_space[k].vz.field_0.m128[2];
                    fVar211 = 1.0 - fVar197;
                    fVar209 = 1.0 - fVar125;
                    fVar123 = fVar209 * fVar209 * fVar209;
                    fVar124 = fVar125 * 3.0 * fVar209 * fVar209;
                    fVar198 = fVar125 * fVar125 * fVar125;
                    fVar144 = fVar125 * fVar125 * 3.0 * fVar209;
                    fVar101 = ((fStack_150 * fVar103 + fStack_154 * fVar102 + local_158 * fVar101) *
                               fVar211 +
                              (fStack_190 * fVar103 + fStack_194 * fVar102 + local_198 * fVar101) *
                              fVar197) * fVar123 +
                              ((fStack_160 * fVar103 + fStack_164 * fVar102 + local_168 * fVar101) *
                               fVar211 +
                              (fStack_1a0 * fVar103 + fStack_1a4 * fVar102 + local_1a8 * fVar101) *
                              fVar197) * fVar124 +
                              ((fStack_170 * fVar103 + fStack_174 * fVar102 + local_178 * fVar101) *
                               fVar211 +
                              (fStack_1b0 * fVar103 + fStack_1b4 * fVar102 + local_1b8 * fVar101) *
                              fVar197) * fVar144 +
                              (fVar211 * (fStack_180 * fVar103 +
                                         fStack_184 * fVar102 + local_188 * fVar101) +
                              (fVar103 * fStack_1c0 + fVar102 * fStack_1c4 + fVar101 * local_1c8) *
                              fVar197) * fVar198;
                    if ((fVar72 <= fVar101) &&
                       (fVar102 = *(float *)(ray + k * 4 + 0x80), fVar101 <= fVar102)) {
                      fVar261 = 1.0 - fVar197;
                      fVar292 = 1.0 - fVar197;
                      fVar306 = 1.0 - fVar197;
                      fVar103 = fVar314 * fVar261 + fVar246 * fVar197;
                      fVar211 = fVar249 * fVar292 + fVar248 * fVar197;
                      fVar222 = fVar301 * fVar306 + fVar278 * fVar197;
                      fVar250 = fVar232 * fVar261 + fVar250 * fVar197;
                      fVar308 = fVar233 * fVar292 + fVar279 * fVar197;
                      fVar312 = fVar251 * fVar306 + fVar142 * fVar197;
                      fVar279 = fVar250 - fVar103;
                      fVar290 = fVar308 - fVar211;
                      fVar316 = fVar312 - fVar222;
                      fVar103 = (((fVar103 - (fVar299 * fVar261 + fVar162 * fVar197)) * fVar209 +
                                 fVar125 * fVar279) * fVar209 +
                                (fVar279 * fVar209 +
                                ((fVar261 * fVar161 + local_288 * fVar197) - fVar250) * fVar125) *
                                fVar125) * 3.0;
                      fVar211 = (((fVar211 - (fVar310 * fVar292 + fVar167 * fVar197)) * fVar209 +
                                 fVar125 * fVar290) * fVar209 +
                                (fVar290 * fVar209 +
                                ((fVar292 * fVar163 + fStack_284 * fVar197) - fVar308) * fVar125) *
                                fVar125) * 3.0;
                      fVar209 = (((fVar222 - (fVar252 * fVar306 + fVar174 * fVar197)) * fVar209 +
                                 fVar125 * fVar316) * fVar209 +
                                (fVar316 * fVar209 +
                                ((fVar306 * fVar169 + fStack_280 * fVar197) - fVar312) * fVar125) *
                                fVar125) * 3.0;
                      pGVar14 = (context->scene->geometries).items[uVar67].ptr;
                      uVar56 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                      pRVar61 = (RTCIntersectArguments *)context;
                      if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar222 = fVar123 * local_298 +
                                  fVar124 * local_2a8 + fVar144 * local_2b8 + fVar198 * local_2c8;
                        fVar261 = fVar123 * fStack_294 +
                                  fVar124 * fStack_2a4 + fVar144 * fStack_2b4 + fVar198 * fStack_2c4
                        ;
                        fVar123 = fVar123 * fStack_290 +
                                  fVar124 * fStack_2a0 + fVar144 * fStack_2b0 + fVar198 * fStack_2c0
                        ;
                        fVar124 = fVar261 * fVar103 - fVar211 * fVar222;
                        fVar144 = fVar123 * fVar211 - fVar209 * fVar261;
                        fVar103 = fVar222 * fVar209 - fVar103 * fVar123;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar101;
                          *(float *)(ray + k * 4 + 0xc0) = fVar144;
                          *(float *)(ray + k * 4 + 0xd0) = fVar103;
                          *(float *)(ray + k * 4 + 0xe0) = fVar124;
                          *(float *)(ray + k * 4 + 0xf0) = fVar125;
                          *(float *)(ray + k * 4 + 0x100) = fVar197;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_3d8;
                          *(uint *)(ray + k * 4 + 0x120) = uVar67;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          uVar69 = context->user->instPrimID[0];
                          uVar56 = (ulong)uVar69;
                          *(uint *)(ray + k * 4 + 0x140) = uVar69;
                        }
                        else {
                          local_e8._0_4_ = fVar144;
                          local_e8._4_4_ = fVar144;
                          local_e8._8_4_ = fVar144;
                          fStack_dc = fVar144;
                          local_d8 = fVar103;
                          fStack_d4 = fVar103;
                          fStack_d0 = fVar103;
                          fStack_cc = fVar103;
                          local_c8 = fVar124;
                          fStack_c4 = fVar124;
                          fStack_c0 = fVar124;
                          fStack_bc = fVar124;
                          local_b8 = fVar125;
                          fStack_b4 = fVar125;
                          fStack_b0 = fVar125;
                          fStack_ac = fVar125;
                          local_a8 = fVar197;
                          fStack_a4 = fVar197;
                          fStack_a0 = fVar197;
                          fStack_9c = fVar197;
                          local_98 = CONCAT44(uStack_2f4,local_2f8);
                          uStack_90 = CONCAT44(uStack_2ec,uStack_2f0);
                          local_88 = CONCAT44(uStack_2e4,local_2e8);
                          uStack_80 = CONCAT44(uStack_2dc,uStack_2e0);
                          local_78 = context->user->instID[0];
                          uStack_74 = local_78;
                          uStack_70 = local_78;
                          uStack_6c = local_78;
                          local_68 = context->user->instPrimID[0];
                          uStack_64 = local_68;
                          uStack_60 = local_68;
                          uStack_5c = local_68;
                          *(float *)(ray + k * 4 + 0x80) = fVar101;
                          local_3f8 = *local_3e8;
                          uStack_3f0 = local_3e8[1];
                          local_3c8.valid = (int *)&local_3f8;
                          local_3c8.geometryUserPtr = pGVar14->userPtr;
                          local_3c8.context = context->user;
                          local_3c8.hit = (RTCHitN *)local_e8;
                          local_3c8.N = 4;
                          p_Var58 = pGVar14->intersectionFilterN;
                          local_3c8.ray = (RTCRayN *)ray;
                          if (p_Var58 != (RTCFilterFunctionN)0x0) {
                            p_Var58 = (RTCFilterFunctionN)(*p_Var58)(&local_3c8);
                          }
                          auVar97._0_4_ = -(uint)((int)local_3f8 == 0);
                          auVar97._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                          auVar97._8_4_ = -(uint)((int)uStack_3f0 == 0);
                          auVar97._12_4_ = -(uint)(uStack_3f0._4_4_ == 0);
                          uVar69 = movmskps((int)p_Var58,auVar97);
                          pRVar59 = (RayHitK<4> *)(ulong)(uVar69 ^ 0xf);
                          if ((uVar69 ^ 0xf) == 0) {
                            auVar97 = auVar97 ^ _DAT_01febe20;
                          }
                          else {
                            pRVar61 = context->args;
                            pRVar62 = (RTCIntersectArguments *)pRVar61->filter;
                            if ((pRVar62 != (RTCIntersectArguments *)0x0) &&
                               ((((ulong)*(Scene **)&pRVar61->flags & 2) != 0 ||
                                (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                              pRVar62 = (RTCIntersectArguments *)(*(code *)pRVar62)(&local_3c8);
                            }
                            auVar121._0_4_ = -(uint)((int)local_3f8 == 0);
                            auVar121._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                            auVar121._8_4_ = -(uint)((int)uStack_3f0 == 0);
                            auVar121._12_4_ = -(uint)(uStack_3f0._4_4_ == 0);
                            auVar97 = auVar121 ^ _DAT_01febe20;
                            uVar69 = movmskps((int)pRVar62,auVar121);
                            pRVar59 = (RayHitK<4> *)(ulong)(uVar69 ^ 0xf);
                            if ((uVar69 ^ 0xf) != 0) {
                              RVar29 = *(RTCFeatureFlags *)((long)local_3c8.hit + 4);
                              uVar69 = *(uint *)((long)local_3c8.hit + 8);
                              uVar70 = *(uint *)((long)((long)local_3c8.hit + 8) + 4);
                              *(uint *)(local_3c8.ray + 0xc0) =
                                   ~auVar121._0_4_ & *(uint *)&(local_3c8.hit)->field_0x0 |
                                   *(uint *)(local_3c8.ray + 0xc0) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0xc4) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0xc4) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 200) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 200) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0xcc) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0xcc) & auVar121._12_4_;
                              RVar29 = *(RTCFeatureFlags *)((long)((long)local_3c8.hit + 0x10) + 4);
                              uVar69 = *(uint *)((long)local_3c8.hit + 0x18);
                              uVar70 = *(uint *)((long)((long)local_3c8.hit + 0x18) + 4);
                              *(uint *)(local_3c8.ray + 0xd0) =
                                   ~auVar121._0_4_ & *(uint *)((long)local_3c8.hit + 0x10) |
                                   *(uint *)(local_3c8.ray + 0xd0) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0xd4) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0xd4) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0xd8) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0xd8) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0xdc) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0xdc) & auVar121._12_4_;
                              RVar29 = ((RTCIntersectArguments *)((long)local_3c8.hit + 0x20))->
                                       feature_mask;
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x20))->context;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x20))->context + 4);
                              *(RTCRayQueryFlags *)(local_3c8.ray + 0xe0) =
                                   ~auVar121._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_3c8.hit + 0x20))->flags |
                                   *(uint *)(local_3c8.ray + 0xe0) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0xe4) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0xe4) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0xe8) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0xe8) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0xec) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0xec) & auVar121._12_4_;
                              RVar29 = *(RTCFeatureFlags *)
                                        ((long)&((RTCIntersectArguments *)
                                                ((long)local_3c8.hit + 0x20))->filter + 4);
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x20))->intersect;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x20))->intersect + 4
                                                );
                              *(uint *)(local_3c8.ray + 0xf0) =
                                   ~auVar121._0_4_ &
                                   *(uint *)&((RTCIntersectArguments *)((long)local_3c8.hit + 0x20))
                                             ->filter |
                                   *(uint *)(local_3c8.ray + 0xf0) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0xf4) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0xf4) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0xf8) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0xf8) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0xfc) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0xfc) & auVar121._12_4_;
                              RVar29 = ((RTCIntersectArguments *)((long)local_3c8.hit + 0x40))->
                                       feature_mask;
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x40))->context;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x40))->context + 4);
                              *(RTCRayQueryFlags *)(local_3c8.ray + 0x100) =
                                   ~auVar121._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_3c8.hit + 0x40))->flags |
                                   *(uint *)(local_3c8.ray + 0x100) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x104) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x104) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0x108) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0x108) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0x10c) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0x10c) & auVar121._12_4_;
                              RVar29 = *(RTCFeatureFlags *)
                                        ((long)&((RTCIntersectArguments *)
                                                ((long)local_3c8.hit + 0x40))->filter + 4);
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x40))->intersect;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x40))->intersect + 4
                                                );
                              *(uint *)(local_3c8.ray + 0x110) =
                                   *(uint *)(local_3c8.ray + 0x110) & auVar121._0_4_ |
                                   ~auVar121._0_4_ &
                                   *(uint *)&((RTCIntersectArguments *)((long)local_3c8.hit + 0x40))
                                             ->filter;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x114) =
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x114) & auVar121._4_4_ |
                                   ~auVar121._4_4_ & RVar29;
                              *(uint *)(local_3c8.ray + 0x118) =
                                   *(uint *)(local_3c8.ray + 0x118) & auVar121._8_4_ |
                                   ~auVar121._8_4_ & uVar69;
                              *(uint *)(local_3c8.ray + 0x11c) =
                                   *(uint *)(local_3c8.ray + 0x11c) & auVar121._12_4_ |
                                   ~auVar121._12_4_ & uVar70;
                              RVar29 = ((RTCIntersectArguments *)((long)local_3c8.hit + 0x60))->
                                       feature_mask;
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x60))->context;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x60))->context + 4);
                              *(RTCRayQueryFlags *)(local_3c8.ray + 0x120) =
                                   *(uint *)(local_3c8.ray + 0x120) & auVar121._0_4_ |
                                   ~auVar121._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_3c8.hit + 0x60))->flags;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x124) =
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x124) & auVar121._4_4_ |
                                   ~auVar121._4_4_ & RVar29;
                              *(uint *)(local_3c8.ray + 0x128) =
                                   *(uint *)(local_3c8.ray + 0x128) & auVar121._8_4_ |
                                   ~auVar121._8_4_ & uVar69;
                              *(uint *)(local_3c8.ray + 300) =
                                   *(uint *)(local_3c8.ray + 300) & auVar121._12_4_ |
                                   ~auVar121._12_4_ & uVar70;
                              RVar29 = *(RTCFeatureFlags *)
                                        ((long)&((RTCIntersectArguments *)
                                                ((long)local_3c8.hit + 0x60))->filter + 4);
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x60))->intersect;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x60))->intersect + 4
                                                );
                              *(uint *)(local_3c8.ray + 0x130) =
                                   ~auVar121._0_4_ &
                                   *(uint *)&((RTCIntersectArguments *)((long)local_3c8.hit + 0x60))
                                             ->filter |
                                   *(uint *)(local_3c8.ray + 0x130) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x134) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x134) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0x138) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0x138) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0x13c) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0x13c) & auVar121._12_4_;
                              RVar29 = ((RTCIntersectArguments *)((long)local_3c8.hit + 0x80))->
                                       feature_mask;
                              uVar69 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_3c8.hit + 0x80))->context;
                              uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_3c8.hit + 0x80))->context + 4);
                              *(RTCRayQueryFlags *)(local_3c8.ray + 0x140) =
                                   ~auVar121._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_3c8.hit + 0x80))->flags |
                                   *(uint *)(local_3c8.ray + 0x140) & auVar121._0_4_;
                              *(RTCFeatureFlags *)(local_3c8.ray + 0x144) =
                                   ~auVar121._4_4_ & RVar29 |
                                   *(RTCFeatureFlags *)(local_3c8.ray + 0x144) & auVar121._4_4_;
                              *(uint *)(local_3c8.ray + 0x148) =
                                   ~auVar121._8_4_ & uVar69 |
                                   *(uint *)(local_3c8.ray + 0x148) & auVar121._8_4_;
                              *(uint *)(local_3c8.ray + 0x14c) =
                                   ~auVar121._12_4_ & uVar70 |
                                   *(uint *)(local_3c8.ray + 0x14c) & auVar121._12_4_;
                              pRVar59 = (RayHitK<4> *)local_3c8.ray;
                              pRVar61 = (RTCIntersectArguments *)local_3c8.hit;
                            }
                          }
                          auVar98._0_4_ = auVar97._0_4_ << 0x1f;
                          auVar98._4_4_ = auVar97._4_4_ << 0x1f;
                          auVar98._8_4_ = auVar97._8_4_ << 0x1f;
                          auVar98._12_4_ = auVar97._12_4_ << 0x1f;
                          uVar69 = movmskps((int)pRVar59,auVar98);
                          uVar56 = (ulong)uVar69;
                          if (uVar69 == 0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar102;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                uVar56 = uVar56 - 1;
              } while (uVar56 != 0);
            }
            else {
              bVar27 = false;
            }
          }
        }
      }
    } while (bVar27);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }